

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx512::CurveNvIntersector1<8>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  int iVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  long lVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  ulong uVar79;
  undefined8 uVar80;
  ulong uVar81;
  RTCIntersectArguments *pRVar82;
  ulong uVar83;
  RTCIntersectArguments *pRVar84;
  Primitive *pPVar85;
  uint uVar86;
  ulong uVar87;
  Geometry *geometry;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  long lVar88;
  bool bVar89;
  float fVar90;
  float fVar134;
  float fVar136;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar95 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar96 [16];
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar140;
  float fVar141;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined4 uVar142;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [64];
  float fVar154;
  float fVar155;
  float fVar161;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar162;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 in_ZMM4 [64];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [16];
  undefined1 auVar196 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_684;
  ulong local_680;
  Ray *local_678;
  RayQueryContext *local_670;
  undefined4 local_664;
  undefined1 local_660 [16];
  Primitive *local_650;
  Precalculations *local_648;
  undefined1 local_640 [24];
  ulong local_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  RTCFilterFunctionNArguments local_5e0;
  undefined8 local_5b0;
  undefined4 local_5a8;
  float local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  uint local_594;
  uint local_590;
  undefined1 local_580 [32];
  undefined8 local_550;
  undefined8 uStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  undefined4 uStack_4fc;
  undefined8 uStack_4f8;
  ulong local_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [12];
  int iStack_4b4;
  int iStack_4b0;
  int iStack_4ac;
  int iStack_4a8;
  int iStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined1 local_350 [16];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  byte local_310;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  uint local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar10 = prim[1];
  uVar79 = (ulong)(byte)PVar10;
  lVar71 = uVar79 * 0x19;
  fVar155 = *(float *)(prim + lVar71 + 0x12);
  auVar95 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar71 + 6));
  fVar147 = fVar155 * (ray->dir).field_0.m128[0];
  fVar154 = fVar155 * auVar95._0_4_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar79 * 4 + 6);
  auVar104 = vpmovsxbd_avx2(auVar93);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar79 * 5 + 6);
  auVar103 = vpmovsxbd_avx2(auVar91);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar79 * 6 + 6);
  auVar113 = vpmovsxbd_avx2(auVar195);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar79 * 0xb + 6);
  auVar114 = vpmovsxbd_avx2(auVar6);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6);
  auVar112 = vpmovsxbd_avx2(auVar7);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (uint)(byte)PVar10 * 0xc + uVar79 + 6);
  auVar111 = vpmovsxbd_avx2(auVar8);
  auVar111 = vcvtdq2ps_avx(auVar111);
  uVar87 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar87 + 6);
  auVar105 = vpmovsxbd_avx2(auVar9);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar87 + uVar79 + 6);
  auVar101 = vpmovsxbd_avx2(auVar92);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar106 = vcvtdq2ps_avx(auVar101);
  uVar83 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar83 + 6);
  auVar110 = vpmovsxbd_avx2(auVar94);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar187._4_4_ = fVar147;
  auVar187._0_4_ = fVar147;
  auVar187._8_4_ = fVar147;
  auVar187._12_4_ = fVar147;
  auVar187._16_4_ = fVar147;
  auVar187._20_4_ = fVar147;
  auVar187._24_4_ = fVar147;
  auVar187._28_4_ = fVar147;
  auVar97 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar102 = ZEXT1632(CONCAT412(fVar155 * (ray->dir).field_0.m128[3],
                                CONCAT48(fVar155 * (ray->dir).field_0.m128[2],
                                         CONCAT44(fVar155 * (ray->dir).field_0.m128[1],fVar147))));
  auVar98 = vpermps_avx512vl(auVar97,auVar102);
  auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar100 = vpermps_avx512vl(auVar99,auVar102);
  fVar147 = auVar100._0_4_;
  auVar153._0_4_ = fVar147 * auVar113._0_4_;
  fVar162 = auVar100._4_4_;
  auVar153._4_4_ = fVar162 * auVar113._4_4_;
  fVar167 = auVar100._8_4_;
  auVar153._8_4_ = fVar167 * auVar113._8_4_;
  fVar168 = auVar100._12_4_;
  auVar153._12_4_ = fVar168 * auVar113._12_4_;
  fVar169 = auVar100._16_4_;
  auVar153._16_4_ = fVar169 * auVar113._16_4_;
  fVar161 = auVar100._20_4_;
  auVar153._20_4_ = fVar161 * auVar113._20_4_;
  fVar90 = auVar100._24_4_;
  auVar153._28_36_ = in_ZMM4._28_36_;
  auVar153._24_4_ = fVar90 * auVar113._24_4_;
  auVar102._4_4_ = auVar111._4_4_ * fVar162;
  auVar102._0_4_ = auVar111._0_4_ * fVar147;
  auVar102._8_4_ = auVar111._8_4_ * fVar167;
  auVar102._12_4_ = auVar111._12_4_ * fVar168;
  auVar102._16_4_ = auVar111._16_4_ * fVar169;
  auVar102._20_4_ = auVar111._20_4_ * fVar161;
  auVar102._24_4_ = auVar111._24_4_ * fVar90;
  auVar102._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = auVar110._4_4_ * fVar162;
  auVar101._0_4_ = auVar110._0_4_ * fVar147;
  auVar101._8_4_ = auVar110._8_4_ * fVar167;
  auVar101._12_4_ = auVar110._12_4_ * fVar168;
  auVar101._16_4_ = auVar110._16_4_ * fVar169;
  auVar101._20_4_ = auVar110._20_4_ * fVar161;
  auVar101._24_4_ = auVar110._24_4_ * fVar90;
  auVar101._28_4_ = auVar100._28_4_;
  auVar93 = vfmadd231ps_fma(auVar153._0_32_,auVar98,auVar103);
  auVar91 = vfmadd231ps_fma(auVar102,auVar98,auVar112);
  auVar195 = vfmadd231ps_fma(auVar101,auVar106,auVar98);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar187,auVar104);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar187,auVar114);
  auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar105,auVar187);
  auVar188._4_4_ = fVar154;
  auVar188._0_4_ = fVar154;
  auVar188._8_4_ = fVar154;
  auVar188._12_4_ = fVar154;
  auVar188._16_4_ = fVar154;
  auVar188._20_4_ = fVar154;
  auVar188._24_4_ = fVar154;
  auVar188._28_4_ = fVar154;
  auVar102 = ZEXT1632(CONCAT412(fVar155 * auVar95._12_4_,
                                CONCAT48(fVar155 * auVar95._8_4_,
                                         CONCAT44(fVar155 * auVar95._4_4_,fVar154))));
  auVar101 = vpermps_avx512vl(auVar97,auVar102);
  auVar102 = vpermps_avx512vl(auVar99,auVar102);
  fVar155 = auVar102._0_4_;
  fVar147 = auVar102._4_4_;
  auVar97._4_4_ = fVar147 * auVar113._4_4_;
  auVar97._0_4_ = fVar155 * auVar113._0_4_;
  fVar162 = auVar102._8_4_;
  auVar97._8_4_ = fVar162 * auVar113._8_4_;
  fVar167 = auVar102._12_4_;
  auVar97._12_4_ = fVar167 * auVar113._12_4_;
  fVar168 = auVar102._16_4_;
  auVar97._16_4_ = fVar168 * auVar113._16_4_;
  fVar169 = auVar102._20_4_;
  auVar97._20_4_ = fVar169 * auVar113._20_4_;
  fVar161 = auVar102._24_4_;
  auVar97._24_4_ = fVar161 * auVar113._24_4_;
  auVar97._28_4_ = auVar113._28_4_;
  auVar108._0_4_ = auVar111._0_4_ * fVar155;
  auVar108._4_4_ = auVar111._4_4_ * fVar147;
  auVar108._8_4_ = auVar111._8_4_ * fVar162;
  auVar108._12_4_ = auVar111._12_4_ * fVar167;
  auVar108._16_4_ = auVar111._16_4_ * fVar168;
  auVar108._20_4_ = auVar111._20_4_ * fVar169;
  auVar108._24_4_ = auVar111._24_4_ * fVar161;
  auVar108._28_4_ = 0;
  auVar111._4_4_ = auVar110._4_4_ * fVar147;
  auVar111._0_4_ = auVar110._0_4_ * fVar155;
  auVar111._8_4_ = auVar110._8_4_ * fVar162;
  auVar111._12_4_ = auVar110._12_4_ * fVar167;
  auVar111._16_4_ = auVar110._16_4_ * fVar168;
  auVar111._20_4_ = auVar110._20_4_ * fVar169;
  auVar111._24_4_ = auVar110._24_4_ * fVar161;
  auVar111._28_4_ = auVar102._28_4_;
  auVar6 = vfmadd231ps_fma(auVar97,auVar101,auVar103);
  auVar7 = vfmadd231ps_fma(auVar108,auVar101,auVar112);
  auVar8 = vfmadd231ps_fma(auVar111,auVar101,auVar106);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar188,auVar104);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar188,auVar114);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar188,auVar105);
  auVar180._8_4_ = 0x7fffffff;
  auVar180._0_8_ = 0x7fffffff7fffffff;
  auVar180._12_4_ = 0x7fffffff;
  auVar180._16_4_ = 0x7fffffff;
  auVar180._20_4_ = 0x7fffffff;
  auVar180._24_4_ = 0x7fffffff;
  auVar180._28_4_ = 0x7fffffff;
  auVar104 = vandps_avx(auVar180,ZEXT1632(auVar93));
  auVar174._8_4_ = 0x219392ef;
  auVar174._0_8_ = 0x219392ef219392ef;
  auVar174._12_4_ = 0x219392ef;
  auVar174._16_4_ = 0x219392ef;
  auVar174._20_4_ = 0x219392ef;
  auVar174._24_4_ = 0x219392ef;
  auVar174._28_4_ = 0x219392ef;
  uVar87 = vcmpps_avx512vl(auVar104,auVar174,1);
  bVar89 = (bool)((byte)uVar87 & 1);
  auVar98._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar93._0_4_;
  bVar89 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar93._4_4_;
  bVar89 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar93._8_4_;
  bVar89 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar93._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(auVar180,ZEXT1632(auVar91));
  uVar87 = vcmpps_avx512vl(auVar104,auVar174,1);
  bVar89 = (bool)((byte)uVar87 & 1);
  auVar99._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar91._0_4_;
  bVar89 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar91._4_4_;
  bVar89 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar91._8_4_;
  bVar89 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar91._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(auVar180,ZEXT1632(auVar195));
  uVar87 = vcmpps_avx512vl(auVar104,auVar174,1);
  bVar89 = (bool)((byte)uVar87 & 1);
  auVar104._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar195._0_4_;
  bVar89 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar195._4_4_;
  bVar89 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar195._8_4_;
  bVar89 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar195._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar103 = vrcp14ps_avx512vl(auVar98);
  auVar175._8_4_ = 0x3f800000;
  auVar175._0_8_ = &DAT_3f8000003f800000;
  auVar175._12_4_ = 0x3f800000;
  auVar175._16_4_ = 0x3f800000;
  auVar175._20_4_ = 0x3f800000;
  auVar175._24_4_ = 0x3f800000;
  auVar175._28_4_ = 0x3f800000;
  auVar93 = vfnmadd213ps_fma(auVar98,auVar103,auVar175);
  auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar99);
  auVar91 = vfnmadd213ps_fma(auVar99,auVar103,auVar175);
  auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar104);
  auVar195 = vfnmadd213ps_fma(auVar104,auVar103,auVar175);
  auVar195 = vfmadd132ps_fma(ZEXT1632(auVar195),auVar103,auVar103);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 7 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar6));
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 9 + 6));
  auVar105._4_4_ = auVar93._4_4_ * auVar104._4_4_;
  auVar105._0_4_ = auVar93._0_4_ * auVar104._0_4_;
  auVar105._8_4_ = auVar93._8_4_ * auVar104._8_4_;
  auVar105._12_4_ = auVar93._12_4_ * auVar104._12_4_;
  auVar105._16_4_ = auVar104._16_4_ * 0.0;
  auVar105._20_4_ = auVar104._20_4_ * 0.0;
  auVar105._24_4_ = auVar104._24_4_ * 0.0;
  auVar105._28_4_ = auVar104._28_4_;
  auVar104 = vcvtdq2ps_avx(auVar103);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar6));
  auVar109._0_4_ = auVar93._0_4_ * auVar104._0_4_;
  auVar109._4_4_ = auVar93._4_4_ * auVar104._4_4_;
  auVar109._8_4_ = auVar93._8_4_ * auVar104._8_4_;
  auVar109._12_4_ = auVar93._12_4_ * auVar104._12_4_;
  auVar109._16_4_ = auVar104._16_4_ * 0.0;
  auVar109._20_4_ = auVar104._20_4_ * 0.0;
  auVar109._24_4_ = auVar104._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar10 * 0x10 + 6));
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar10 * 0x10 + uVar79 * -2 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar7));
  auVar106._4_4_ = auVar91._4_4_ * auVar104._4_4_;
  auVar106._0_4_ = auVar91._0_4_ * auVar104._0_4_;
  auVar106._8_4_ = auVar91._8_4_ * auVar104._8_4_;
  auVar106._12_4_ = auVar91._12_4_ * auVar104._12_4_;
  auVar106._16_4_ = auVar104._16_4_ * 0.0;
  auVar106._20_4_ = auVar104._20_4_ * 0.0;
  auVar106._24_4_ = auVar104._24_4_ * 0.0;
  auVar106._28_4_ = auVar104._28_4_;
  auVar104 = vcvtdq2ps_avx(auVar103);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar7));
  auVar107._0_4_ = auVar91._0_4_ * auVar104._0_4_;
  auVar107._4_4_ = auVar91._4_4_ * auVar104._4_4_;
  auVar107._8_4_ = auVar91._8_4_ * auVar104._8_4_;
  auVar107._12_4_ = auVar91._12_4_ * auVar104._12_4_;
  auVar107._16_4_ = auVar104._16_4_ * 0.0;
  auVar107._20_4_ = auVar104._20_4_ * 0.0;
  auVar107._24_4_ = auVar104._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 + uVar79 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar8));
  auVar110._4_4_ = auVar104._4_4_ * auVar195._4_4_;
  auVar110._0_4_ = auVar104._0_4_ * auVar195._0_4_;
  auVar110._8_4_ = auVar104._8_4_ * auVar195._8_4_;
  auVar110._12_4_ = auVar104._12_4_ * auVar195._12_4_;
  auVar110._16_4_ = auVar104._16_4_ * 0.0;
  auVar110._20_4_ = auVar104._20_4_ * 0.0;
  auVar110._24_4_ = auVar104._24_4_ * 0.0;
  auVar110._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x17 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar8));
  auVar100._0_4_ = auVar195._0_4_ * auVar104._0_4_;
  auVar100._4_4_ = auVar195._4_4_ * auVar104._4_4_;
  auVar100._8_4_ = auVar195._8_4_ * auVar104._8_4_;
  auVar100._12_4_ = auVar195._12_4_ * auVar104._12_4_;
  auVar100._16_4_ = auVar104._16_4_ * 0.0;
  auVar100._20_4_ = auVar104._20_4_ * 0.0;
  auVar100._24_4_ = auVar104._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar104 = vpminsd_avx2(auVar105,auVar109);
  auVar103 = vpminsd_avx2(auVar106,auVar107);
  auVar104 = vmaxps_avx(auVar104,auVar103);
  auVar103 = vpminsd_avx2(auVar110,auVar100);
  uVar142 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar113._4_4_ = uVar142;
  auVar113._0_4_ = uVar142;
  auVar113._8_4_ = uVar142;
  auVar113._12_4_ = uVar142;
  auVar113._16_4_ = uVar142;
  auVar113._20_4_ = uVar142;
  auVar113._24_4_ = uVar142;
  auVar113._28_4_ = uVar142;
  auVar103 = vmaxps_avx512vl(auVar103,auVar113);
  auVar104 = vmaxps_avx(auVar104,auVar103);
  auVar103._8_4_ = 0x3f7ffffa;
  auVar103._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar103._12_4_ = 0x3f7ffffa;
  auVar103._16_4_ = 0x3f7ffffa;
  auVar103._20_4_ = 0x3f7ffffa;
  auVar103._24_4_ = 0x3f7ffffa;
  auVar103._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar104,auVar103);
  auVar176 = ZEXT3264(local_80);
  auVar104 = vpmaxsd_avx2(auVar105,auVar109);
  auVar153 = ZEXT3264(auVar104);
  auVar103 = vpmaxsd_avx2(auVar106,auVar107);
  auVar104 = vminps_avx(auVar104,auVar103);
  auVar103 = vpmaxsd_avx2(auVar110,auVar100);
  fVar155 = ray->tfar;
  auVar114._4_4_ = fVar155;
  auVar114._0_4_ = fVar155;
  auVar114._8_4_ = fVar155;
  auVar114._12_4_ = fVar155;
  auVar114._16_4_ = fVar155;
  auVar114._20_4_ = fVar155;
  auVar114._24_4_ = fVar155;
  auVar114._28_4_ = fVar155;
  auVar103 = vminps_avx512vl(auVar103,auVar114);
  auVar104 = vminps_avx(auVar104,auVar103);
  auVar112._8_4_ = 0x3f800003;
  auVar112._0_8_ = 0x3f8000033f800003;
  auVar112._12_4_ = 0x3f800003;
  auVar112._16_4_ = 0x3f800003;
  auVar112._20_4_ = 0x3f800003;
  auVar112._24_4_ = 0x3f800003;
  auVar112._28_4_ = 0x3f800003;
  auVar104 = vmulps_avx512vl(auVar104,auVar112);
  auVar103 = vpbroadcastd_avx512vl();
  uVar22 = vpcmpgtd_avx512vl(auVar103,_DAT_0205a920);
  uVar80 = vcmpps_avx512vl(local_80,auVar104,2);
  bVar89 = (byte)((byte)uVar80 & (byte)uVar22) != 0;
  if (bVar89) {
    uVar87 = (ulong)(byte)((byte)uVar80 & (byte)uVar22);
    pPVar85 = prim;
    local_648 = pre;
    do {
      auVar103 = auVar176._0_32_;
      auVar104 = auVar153._0_32_;
      local_4a0 = in_ZMM21._0_32_;
      local_480 = in_ZMM20._0_32_;
      lVar23 = 0;
      for (uVar79 = uVar87; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar87 = uVar87 - 1 & uVar87;
      local_664 = *(undefined4 *)(pPVar85 + lVar23 * 4 + 6);
      uVar79 = (ulong)(uint)((int)lVar23 << 6);
      local_628 = (ulong)*(uint *)(pPVar85 + 2);
      pGVar12 = (context->scene->geometries).items[local_628].ptr;
      local_660 = *(undefined1 (*) [16])(prim + uVar79 + lVar71 + 0x16);
      if (uVar87 != 0) {
        uVar81 = uVar87 - 1 & uVar87;
        for (uVar83 = uVar87; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        }
        if (uVar81 != 0) {
          for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_3f0 = *(undefined1 (*) [16])(prim + uVar79 + lVar71 + 0x26);
      local_400 = *(undefined1 (*) [16])(prim + uVar79 + lVar71 + 0x36);
      local_410 = *(undefined1 (*) [16])(prim + uVar79 + lVar71 + 0x46);
      iVar11 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar3 = (ray->org).field_0;
      auVar91 = vsubps_avx512vl(local_660,(undefined1  [16])aVar3);
      uVar142 = auVar91._0_4_;
      auVar95._4_4_ = uVar142;
      auVar95._0_4_ = uVar142;
      auVar95._8_4_ = uVar142;
      auVar95._12_4_ = uVar142;
      auVar93 = vshufps_avx(auVar91,auVar91,0x55);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      aVar4 = (pre->ray_space).vx.field_0;
      aVar5 = (pre->ray_space).vy.field_0;
      fVar155 = (pre->ray_space).vz.field_0.m128[0];
      fVar147 = (pre->ray_space).vz.field_0.m128[1];
      fVar162 = (pre->ray_space).vz.field_0.m128[2];
      fVar167 = (pre->ray_space).vz.field_0.m128[3];
      auVar179._0_4_ = auVar91._0_4_ * fVar155;
      auVar179._4_4_ = auVar91._4_4_ * fVar147;
      auVar179._8_4_ = auVar91._8_4_ * fVar162;
      auVar179._12_4_ = auVar91._12_4_ * fVar167;
      auVar93 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar93);
      auVar195 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar4,auVar95);
      auVar92 = vshufps_avx512vl(local_660,local_660,0xff);
      auVar91 = vsubps_avx(local_3f0,(undefined1  [16])aVar3);
      uVar142 = auVar91._0_4_;
      auVar156._4_4_ = uVar142;
      auVar156._0_4_ = uVar142;
      auVar156._8_4_ = uVar142;
      auVar156._12_4_ = uVar142;
      auVar93 = vshufps_avx(auVar91,auVar91,0x55);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar182._0_4_ = auVar91._0_4_ * fVar155;
      auVar182._4_4_ = auVar91._4_4_ * fVar147;
      auVar182._8_4_ = auVar91._8_4_ * fVar162;
      auVar182._12_4_ = auVar91._12_4_ * fVar167;
      auVar93 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar5,auVar93);
      auVar6 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar4,auVar156);
      auVar91 = vsubps_avx512vl(local_400,(undefined1  [16])aVar3);
      uVar142 = auVar91._0_4_;
      auVar96._4_4_ = uVar142;
      auVar96._0_4_ = uVar142;
      auVar96._8_4_ = uVar142;
      auVar96._12_4_ = uVar142;
      auVar93 = vshufps_avx(auVar91,auVar91,0x55);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar184._0_4_ = auVar91._0_4_ * fVar155;
      auVar184._4_4_ = auVar91._4_4_ * fVar147;
      auVar184._8_4_ = auVar91._8_4_ * fVar162;
      auVar184._12_4_ = auVar91._12_4_ * fVar167;
      auVar93 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar5,auVar93);
      auVar7 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar4,auVar96);
      auVar91 = vsubps_avx512vl(local_410,(undefined1  [16])aVar3);
      uVar142 = auVar91._0_4_;
      auVar148._4_4_ = uVar142;
      auVar148._0_4_ = uVar142;
      auVar148._8_4_ = uVar142;
      auVar148._12_4_ = uVar142;
      auVar93 = vshufps_avx(auVar91,auVar91,0x55);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar185._0_4_ = auVar91._0_4_ * fVar155;
      auVar185._4_4_ = auVar91._4_4_ * fVar147;
      auVar185._8_4_ = auVar91._8_4_ * fVar162;
      auVar185._12_4_ = auVar91._12_4_ * fVar167;
      auVar93 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar5,auVar93);
      auVar8 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar4,auVar148);
      lVar23 = (long)iVar11 * 0x44;
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar23);
      uVar142 = auVar195._0_4_;
      local_440._4_4_ = uVar142;
      local_440._0_4_ = uVar142;
      local_440._8_4_ = uVar142;
      local_440._12_4_ = uVar142;
      local_440._16_4_ = uVar142;
      local_440._20_4_ = uVar142;
      local_440._24_4_ = uVar142;
      local_440._28_4_ = uVar142;
      auVar146._8_4_ = 1;
      auVar146._0_8_ = 0x100000001;
      auVar146._12_4_ = 1;
      auVar146._16_4_ = 1;
      auVar146._20_4_ = 1;
      auVar146._24_4_ = 1;
      auVar146._28_4_ = 1;
      local_460 = vpermps_avx512vl(auVar146,ZEXT1632(auVar195));
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x484);
      local_540 = vbroadcastss_avx512vl(auVar6);
      local_200 = vpermps_avx2(auVar146,ZEXT1632(auVar6));
      auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x908);
      local_a0 = vbroadcastss_avx512vl(auVar7);
      local_c0 = vpermps_avx512vl(auVar146,ZEXT1632(auVar7));
      auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0xd8c);
      local_e0 = vbroadcastss_avx512vl(auVar8);
      local_100 = vpermps_avx512vl(auVar146,ZEXT1632(auVar8));
      auVar105 = vmulps_avx512vl(local_e0,auVar111);
      auVar106 = vmulps_avx512vl(local_100,auVar111);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar112,local_a0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar112,local_c0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar114,local_540);
      auVar93 = vfmadd231ps_fma(auVar106,auVar114,local_200);
      auVar97 = vfmadd231ps_avx512vl(auVar105,auVar113,local_440);
      auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar113,local_460);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar23);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x484);
      auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x908);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0xd8c);
      auVar102 = vmulps_avx512vl(local_e0,auVar101);
      auVar99 = vmulps_avx512vl(local_100,auVar101);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar110,local_a0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar110,local_c0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,local_540);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar106,local_200);
      auVar9 = vfmadd231ps_fma(auVar102,auVar105,local_440);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar105,local_460);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar9),auVar97);
      local_580 = vsubps_avx(auVar99,auVar98);
      auVar102 = vmulps_avx512vl(auVar98,auVar100);
      auVar107 = vmulps_avx512vl(auVar97,local_580);
      auVar102 = vsubps_avx512vl(auVar102,auVar107);
      auVar93 = vshufps_avx(local_3f0,local_3f0,0xff);
      uVar80 = auVar92._0_8_;
      local_120._8_8_ = uVar80;
      local_120._0_8_ = uVar80;
      local_120._16_8_ = uVar80;
      local_120._24_8_ = uVar80;
      local_140 = vbroadcastsd_avx512vl(auVar93);
      auVar93 = vshufps_avx512vl(local_400,local_400,0xff);
      local_160 = vbroadcastsd_avx512vl(auVar93);
      auVar93 = vshufps_avx512vl(local_410,local_410,0xff);
      uVar80 = auVar93._0_8_;
      register0x00001248 = uVar80;
      local_180 = uVar80;
      register0x00001250 = uVar80;
      register0x00001258 = uVar80;
      auVar107 = vmulps_avx512vl(_local_180,auVar111);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar112,local_160);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,local_140);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar113,local_120);
      auVar108 = vmulps_avx512vl(_local_180,auVar101);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar110,local_160);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,local_140);
      auVar92 = vfmadd231ps_fma(auVar108,auVar105,local_120);
      auVar108 = vmulps_avx512vl(local_580,local_580);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar100,auVar100);
      auVar109 = vmaxps_avx512vl(auVar107,ZEXT1632(auVar92));
      auVar109 = vmulps_avx512vl(auVar109,auVar109);
      auVar108 = vmulps_avx512vl(auVar109,auVar108);
      auVar102 = vmulps_avx512vl(auVar102,auVar102);
      uVar80 = vcmpps_avx512vl(auVar102,auVar108,2);
      auVar93 = vblendps_avx(auVar195,local_660,8);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar91 = vandps_avx512vl(auVar93,auVar94);
      auVar93 = vblendps_avx(auVar6,local_3f0,8);
      auVar93 = vandps_avx512vl(auVar93,auVar94);
      auVar91 = vmaxps_avx(auVar91,auVar93);
      auVar93 = vblendps_avx(auVar7,local_400,8);
      auVar95 = vandps_avx512vl(auVar93,auVar94);
      auVar93 = vblendps_avx(auVar8,local_410,8);
      auVar93 = vandps_avx512vl(auVar93,auVar94);
      auVar93 = vmaxps_avx(auVar95,auVar93);
      auVar93 = vmaxps_avx(auVar91,auVar93);
      auVar91 = vmovshdup_avx(auVar93);
      auVar91 = vmaxss_avx(auVar91,auVar93);
      auVar93 = vshufpd_avx(auVar93,auVar93,1);
      auVar93 = vmaxss_avx(auVar93,auVar91);
      local_640._0_16_ = vcvtsi2ss_avx512f(local_410,iVar11);
      auVar186._0_4_ = local_640._0_4_;
      auVar186._4_4_ = auVar186._0_4_;
      auVar186._8_4_ = auVar186._0_4_;
      auVar186._12_4_ = auVar186._0_4_;
      auVar186._16_4_ = auVar186._0_4_;
      auVar186._20_4_ = auVar186._0_4_;
      auVar186._24_4_ = auVar186._0_4_;
      auVar186._28_4_ = auVar186._0_4_;
      uVar22 = vcmpps_avx512vl(auVar186,_DAT_02020f40,0xe);
      local_310 = (byte)uVar80 & (byte)uVar22;
      local_4e0 = auVar93._0_4_ * 4.7683716e-07;
      auVar159._8_4_ = 2;
      auVar159._0_8_ = 0x200000002;
      auVar159._12_4_ = 2;
      auVar159._16_4_ = 2;
      auVar159._20_4_ = 2;
      auVar159._24_4_ = 2;
      auVar159._28_4_ = 2;
      local_1a0 = vpermps_avx512vl(auVar159,ZEXT1632(auVar195));
      local_1c0 = vpermps_avx512vl(auVar159,ZEXT1632(auVar6));
      local_1e0 = vpermps_avx512vl(auVar159,ZEXT1632(auVar7));
      auVar102 = vpermps_avx2(auVar159,ZEXT1632(auVar8));
      fVar155 = *(float *)((long)&(ray->org).field_0 + 0xc);
      auVar93 = local_100._0_16_;
      _local_3e0 = ZEXT416((uint)local_4e0);
      if (local_310 == 0) {
        pRVar82 = (RTCIntersectArguments *)0x0;
        auVar93 = vxorps_avx512vl(auVar93,auVar93);
        auVar196 = ZEXT1664(auVar93);
        auVar176 = ZEXT3264(auVar103);
        in_ZMM20 = ZEXT3264(local_480);
        auVar153 = ZEXT3264(auVar104);
        in_ZMM21 = ZEXT3264(local_4a0);
        auVar194 = ZEXT3264(local_440);
        auVar193 = ZEXT3264(local_460);
        auVar192 = ZEXT3264(local_540);
      }
      else {
        fStack_4dc = 0.0;
        fStack_4d8 = 0.0;
        fStack_4d4 = 0.0;
        auVar101 = vmulps_avx512vl(auVar102,auVar101);
        auVar110 = vfmadd213ps_avx512vl(auVar110,local_1e0,auVar101);
        auVar106 = vfmadd213ps_avx512vl(auVar106,local_1c0,auVar110);
        auVar106 = vfmadd213ps_avx512vl(auVar105,local_1a0,auVar106);
        auVar111 = vmulps_avx512vl(auVar102,auVar111);
        auVar112 = vfmadd213ps_avx512vl(auVar112,local_1e0,auVar111);
        auVar110 = vfmadd213ps_avx512vl(auVar114,local_1c0,auVar112);
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1210);
        auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1694);
        auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1b18);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1f9c);
        auVar110 = vfmadd213ps_avx512vl(auVar113,local_1a0,auVar110);
        auVar113 = vmulps_avx512vl(local_e0,auVar105);
        auVar101 = vmulps_avx512vl(local_100,auVar105);
        auVar33._4_4_ = auVar102._4_4_ * auVar105._4_4_;
        auVar33._0_4_ = auVar102._0_4_ * auVar105._0_4_;
        auVar33._8_4_ = auVar102._8_4_ * auVar105._8_4_;
        auVar33._12_4_ = auVar102._12_4_ * auVar105._12_4_;
        auVar33._16_4_ = auVar102._16_4_ * auVar105._16_4_;
        auVar33._20_4_ = auVar102._20_4_ * auVar105._20_4_;
        auVar33._24_4_ = auVar102._24_4_ * auVar105._24_4_;
        auVar33._28_4_ = auVar105._28_4_;
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar111,local_a0);
        auVar105 = vfmadd231ps_avx512vl(auVar101,auVar111,local_c0);
        auVar111 = vfmadd231ps_avx512vl(auVar33,local_1e0,auVar111);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar112,local_540);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar112,local_200);
        auVar101 = vfmadd231ps_avx512vl(auVar111,local_1c0,auVar112);
        auVar108 = vfmadd231ps_avx512vl(auVar113,auVar114,local_440);
        auVar193 = ZEXT3264(local_460);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar114,local_460);
        auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1210);
        auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1b18);
        auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1f9c);
        auVar101 = vfmadd231ps_avx512vl(auVar101,local_1a0,auVar114);
        auVar114 = vmulps_avx512vl(local_e0,auVar111);
        auVar109 = vmulps_avx512vl(local_100,auVar111);
        auVar34._4_4_ = auVar102._4_4_ * auVar111._4_4_;
        auVar34._0_4_ = auVar102._0_4_ * auVar111._0_4_;
        auVar34._8_4_ = auVar102._8_4_ * auVar111._8_4_;
        auVar34._12_4_ = auVar102._12_4_ * auVar111._12_4_;
        auVar34._16_4_ = auVar102._16_4_ * auVar111._16_4_;
        auVar34._20_4_ = auVar102._20_4_ * auVar111._20_4_;
        auVar34._24_4_ = auVar102._24_4_ * auVar111._24_4_;
        auVar34._28_4_ = auVar111._28_4_;
        auVar111 = vfmadd231ps_avx512vl(auVar114,auVar112,local_a0);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar112,local_c0);
        auVar112 = vfmadd231ps_avx512vl(auVar34,local_1e0,auVar112);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1694);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,local_540);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar114,local_200);
        auVar114 = vfmadd231ps_avx512vl(auVar112,local_1c0,auVar114);
        auVar112 = vfmadd231ps_avx512vl(auVar111,auVar113,local_440);
        auVar111 = vfmadd231ps_avx512vl(auVar109,auVar113,local_460);
        auVar109 = vfmadd231ps_avx512vl(auVar114,local_1a0,auVar113);
        auVar190._8_4_ = 0x7fffffff;
        auVar190._0_8_ = 0x7fffffff7fffffff;
        auVar190._12_4_ = 0x7fffffff;
        auVar190._16_4_ = 0x7fffffff;
        auVar190._20_4_ = 0x7fffffff;
        auVar190._24_4_ = 0x7fffffff;
        auVar190._28_4_ = 0x7fffffff;
        auVar113 = vandps_avx(auVar108,auVar190);
        auVar114 = vandps_avx(auVar105,auVar190);
        auVar114 = vmaxps_avx(auVar113,auVar114);
        auVar113 = vandps_avx(auVar101,auVar190);
        auVar113 = vmaxps_avx(auVar114,auVar113);
        auVar101 = vbroadcastss_avx512vl(_local_3e0);
        uVar79 = vcmpps_avx512vl(auVar113,auVar101,1);
        local_4c0._0_4_ = auVar100._0_4_;
        local_4c0._4_4_ = auVar100._4_4_;
        local_4c0._8_4_ = auVar100._8_4_;
        iStack_4b4 = auVar100._12_4_;
        iStack_4b0 = auVar100._16_4_;
        iStack_4ac = auVar100._20_4_;
        iStack_4a8 = auVar100._24_4_;
        iStack_4a4 = auVar100._28_4_;
        bVar15 = (bool)((byte)uVar79 & 1);
        auVar115._0_4_ = (float)((uint)bVar15 * local_4c0._0_4_ | (uint)!bVar15 * auVar108._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar15 * local_4c0._4_4_ | (uint)!bVar15 * auVar108._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar15 * local_4c0._8_4_ | (uint)!bVar15 * auVar108._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar15 * iStack_4b4 | (uint)!bVar15 * auVar108._12_4_);
        bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar15 * iStack_4b0 | (uint)!bVar15 * auVar108._16_4_);
        bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar15 * iStack_4ac | (uint)!bVar15 * auVar108._20_4_);
        bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar15 * iStack_4a8 | (uint)!bVar15 * auVar108._24_4_);
        bVar15 = SUB81(uVar79 >> 7,0);
        auVar115._28_4_ = (uint)bVar15 * iStack_4a4 | (uint)!bVar15 * auVar108._28_4_;
        bVar15 = (bool)((byte)uVar79 & 1);
        auVar116._0_4_ = (float)((uint)bVar15 * local_580._0_4_ | (uint)!bVar15 * auVar105._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar15 * local_580._4_4_ | (uint)!bVar15 * auVar105._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar15 * local_580._8_4_ | (uint)!bVar15 * auVar105._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar15 * local_580._12_4_ | (uint)!bVar15 * auVar105._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar15 * local_580._16_4_ | (uint)!bVar15 * auVar105._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar15 * local_580._20_4_ | (uint)!bVar15 * auVar105._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar15 * local_580._24_4_ | (uint)!bVar15 * auVar105._24_4_)
        ;
        bVar15 = SUB81(uVar79 >> 7,0);
        auVar116._28_4_ = (uint)bVar15 * local_580._28_4_ | (uint)!bVar15 * auVar105._28_4_;
        auVar113 = vandps_avx(auVar190,auVar112);
        auVar114 = vandps_avx(auVar111,auVar190);
        auVar114 = vmaxps_avx(auVar113,auVar114);
        auVar113 = vandps_avx(auVar109,auVar190);
        auVar113 = vmaxps_avx(auVar114,auVar113);
        uVar79 = vcmpps_avx512vl(auVar113,auVar101,1);
        bVar15 = (bool)((byte)uVar79 & 1);
        auVar117._0_4_ = (float)((uint)bVar15 * local_4c0._0_4_ | (uint)!bVar15 * auVar112._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar15 * local_4c0._4_4_ | (uint)!bVar15 * auVar112._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar15 * local_4c0._8_4_ | (uint)!bVar15 * auVar112._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar15 * iStack_4b4 | (uint)!bVar15 * auVar112._12_4_);
        bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar15 * iStack_4b0 | (uint)!bVar15 * auVar112._16_4_);
        bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar15 * iStack_4ac | (uint)!bVar15 * auVar112._20_4_);
        bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar15 * iStack_4a8 | (uint)!bVar15 * auVar112._24_4_);
        bVar15 = SUB81(uVar79 >> 7,0);
        auVar117._28_4_ = (uint)bVar15 * iStack_4a4 | (uint)!bVar15 * auVar112._28_4_;
        bVar15 = (bool)((byte)uVar79 & 1);
        auVar118._0_4_ = (float)((uint)bVar15 * local_580._0_4_ | (uint)!bVar15 * auVar111._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar15 * local_580._4_4_ | (uint)!bVar15 * auVar111._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar15 * local_580._8_4_ | (uint)!bVar15 * auVar111._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar15 * local_580._12_4_ | (uint)!bVar15 * auVar111._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar15 * local_580._16_4_ | (uint)!bVar15 * auVar111._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar15 * local_580._20_4_ | (uint)!bVar15 * auVar111._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar15 * local_580._24_4_ | (uint)!bVar15 * auVar111._24_4_)
        ;
        bVar15 = SUB81(uVar79 >> 7,0);
        auVar118._28_4_ = (uint)bVar15 * local_580._28_4_ | (uint)!bVar15 * auVar111._28_4_;
        auVar96 = vxorps_avx512vl(auVar93,auVar93);
        auVar196 = ZEXT1664(auVar96);
        auVar113 = vfmadd213ps_avx512vl(auVar115,auVar115,ZEXT1632(auVar96));
        auVar93 = vfmadd231ps_fma(auVar113,auVar116,auVar116);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
        fVar147 = auVar113._0_4_;
        fVar162 = auVar113._4_4_;
        fVar167 = auVar113._8_4_;
        fVar168 = auVar113._12_4_;
        fVar169 = auVar113._16_4_;
        fVar161 = auVar113._20_4_;
        fVar90 = auVar113._24_4_;
        auVar35._4_4_ = fVar162 * fVar162 * fVar162 * auVar93._4_4_ * -0.5;
        auVar35._0_4_ = fVar147 * fVar147 * fVar147 * auVar93._0_4_ * -0.5;
        auVar35._8_4_ = fVar167 * fVar167 * fVar167 * auVar93._8_4_ * -0.5;
        auVar35._12_4_ = fVar168 * fVar168 * fVar168 * auVar93._12_4_ * -0.5;
        auVar35._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar35._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar35._24_4_ = fVar90 * fVar90 * fVar90 * -0.0;
        auVar35._28_4_ = 0;
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar112 = vfmadd231ps_avx512vl(auVar35,auVar114,auVar113);
        auVar36._4_4_ = auVar116._4_4_ * auVar112._4_4_;
        auVar36._0_4_ = auVar116._0_4_ * auVar112._0_4_;
        auVar36._8_4_ = auVar116._8_4_ * auVar112._8_4_;
        auVar36._12_4_ = auVar116._12_4_ * auVar112._12_4_;
        auVar36._16_4_ = auVar116._16_4_ * auVar112._16_4_;
        auVar36._20_4_ = auVar116._20_4_ * auVar112._20_4_;
        auVar36._24_4_ = auVar116._24_4_ * auVar112._24_4_;
        auVar36._28_4_ = auVar113._28_4_;
        auVar37._4_4_ = auVar112._4_4_ * -auVar115._4_4_;
        auVar37._0_4_ = auVar112._0_4_ * -auVar115._0_4_;
        auVar37._8_4_ = auVar112._8_4_ * -auVar115._8_4_;
        auVar37._12_4_ = auVar112._12_4_ * -auVar115._12_4_;
        auVar37._16_4_ = auVar112._16_4_ * -auVar115._16_4_;
        auVar37._20_4_ = auVar112._20_4_ * -auVar115._20_4_;
        auVar37._24_4_ = auVar112._24_4_ * -auVar115._24_4_;
        auVar37._28_4_ = auVar115._28_4_ ^ 0x80000000;
        auVar113 = vmulps_avx512vl(auVar112,ZEXT1632(auVar96));
        auVar108 = ZEXT1632(auVar96);
        auVar111 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar108);
        auVar93 = vfmadd231ps_fma(auVar111,auVar118,auVar118);
        auVar111 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
        fVar147 = auVar111._0_4_;
        fVar162 = auVar111._4_4_;
        fVar167 = auVar111._8_4_;
        fVar168 = auVar111._12_4_;
        fVar169 = auVar111._16_4_;
        fVar161 = auVar111._20_4_;
        fVar90 = auVar111._24_4_;
        auVar38._4_4_ = fVar162 * fVar162 * fVar162 * auVar93._4_4_ * -0.5;
        auVar38._0_4_ = fVar147 * fVar147 * fVar147 * auVar93._0_4_ * -0.5;
        auVar38._8_4_ = fVar167 * fVar167 * fVar167 * auVar93._8_4_ * -0.5;
        auVar38._12_4_ = fVar168 * fVar168 * fVar168 * auVar93._12_4_ * -0.5;
        auVar38._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar38._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar38._24_4_ = fVar90 * fVar90 * fVar90 * -0.0;
        auVar38._28_4_ = 0;
        auVar114 = vfmadd231ps_avx512vl(auVar38,auVar114,auVar111);
        auVar39._4_4_ = auVar118._4_4_ * auVar114._4_4_;
        auVar39._0_4_ = auVar118._0_4_ * auVar114._0_4_;
        auVar39._8_4_ = auVar118._8_4_ * auVar114._8_4_;
        auVar39._12_4_ = auVar118._12_4_ * auVar114._12_4_;
        auVar39._16_4_ = auVar118._16_4_ * auVar114._16_4_;
        auVar39._20_4_ = auVar118._20_4_ * auVar114._20_4_;
        auVar39._24_4_ = auVar118._24_4_ * auVar114._24_4_;
        auVar39._28_4_ = auVar111._28_4_;
        auVar40._4_4_ = -auVar117._4_4_ * auVar114._4_4_;
        auVar40._0_4_ = -auVar117._0_4_ * auVar114._0_4_;
        auVar40._8_4_ = -auVar117._8_4_ * auVar114._8_4_;
        auVar40._12_4_ = -auVar117._12_4_ * auVar114._12_4_;
        auVar40._16_4_ = -auVar117._16_4_ * auVar114._16_4_;
        auVar40._20_4_ = -auVar117._20_4_ * auVar114._20_4_;
        auVar40._24_4_ = -auVar117._24_4_ * auVar114._24_4_;
        auVar40._28_4_ = auVar112._28_4_;
        auVar114 = vmulps_avx512vl(auVar114,auVar108);
        auVar93 = vfmadd213ps_fma(auVar36,auVar107,auVar97);
        auVar91 = vfmadd213ps_fma(auVar37,auVar107,auVar98);
        auVar112 = vfmadd213ps_avx512vl(auVar113,auVar107,auVar110);
        auVar111 = vfmadd213ps_avx512vl(auVar39,ZEXT1632(auVar92),ZEXT1632(auVar9));
        auVar94 = vfnmadd213ps_fma(auVar36,auVar107,auVar97);
        auVar101 = ZEXT1632(auVar92);
        auVar195 = vfmadd213ps_fma(auVar40,auVar101,auVar99);
        auVar95 = vfnmadd213ps_fma(auVar37,auVar107,auVar98);
        auVar6 = vfmadd213ps_fma(auVar114,auVar101,auVar106);
        auVar105 = vfnmadd231ps_avx512vl(auVar110,auVar107,auVar113);
        auVar9 = vfnmadd213ps_fma(auVar39,auVar101,ZEXT1632(auVar9));
        auVar148 = vfnmadd213ps_fma(auVar40,auVar101,auVar99);
        auVar156 = vfnmadd231ps_fma(auVar106,ZEXT1632(auVar92),auVar114);
        auVar114 = vsubps_avx512vl(auVar111,ZEXT1632(auVar94));
        auVar113 = vsubps_avx(ZEXT1632(auVar195),ZEXT1632(auVar95));
        auVar106 = vsubps_avx512vl(ZEXT1632(auVar6),auVar105);
        auVar110 = vmulps_avx512vl(auVar113,auVar105);
        auVar7 = vfmsub231ps_fma(auVar110,ZEXT1632(auVar95),auVar106);
        auVar41._4_4_ = auVar94._4_4_ * auVar106._4_4_;
        auVar41._0_4_ = auVar94._0_4_ * auVar106._0_4_;
        auVar41._8_4_ = auVar94._8_4_ * auVar106._8_4_;
        auVar41._12_4_ = auVar94._12_4_ * auVar106._12_4_;
        auVar41._16_4_ = auVar106._16_4_ * 0.0;
        auVar41._20_4_ = auVar106._20_4_ * 0.0;
        auVar41._24_4_ = auVar106._24_4_ * 0.0;
        auVar41._28_4_ = auVar106._28_4_;
        auVar106 = vfmsub231ps_avx512vl(auVar41,auVar105,auVar114);
        auVar42._4_4_ = auVar95._4_4_ * auVar114._4_4_;
        auVar42._0_4_ = auVar95._0_4_ * auVar114._0_4_;
        auVar42._8_4_ = auVar95._8_4_ * auVar114._8_4_;
        auVar42._12_4_ = auVar95._12_4_ * auVar114._12_4_;
        auVar42._16_4_ = auVar114._16_4_ * 0.0;
        auVar42._20_4_ = auVar114._20_4_ * 0.0;
        auVar42._24_4_ = auVar114._24_4_ * 0.0;
        auVar42._28_4_ = auVar114._28_4_;
        auVar8 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar94),auVar113);
        auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar108,auVar106);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar108,ZEXT1632(auVar7));
        auVar108 = ZEXT1632(auVar96);
        uVar79 = vcmpps_avx512vl(auVar113,auVar108,2);
        bVar14 = (byte)uVar79;
        fVar90 = (float)((uint)(bVar14 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar14 & 1) * auVar9._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        fVar134 = (float)((uint)bVar15 * auVar93._4_4_ | (uint)!bVar15 * auVar9._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        fVar136 = (float)((uint)bVar15 * auVar93._8_4_ | (uint)!bVar15 * auVar9._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        fVar138 = (float)((uint)bVar15 * auVar93._12_4_ | (uint)!bVar15 * auVar9._12_4_);
        auVar110 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar90))));
        fVar154 = (float)((uint)(bVar14 & 1) * auVar91._0_4_ |
                         (uint)!(bool)(bVar14 & 1) * auVar148._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        fVar135 = (float)((uint)bVar15 * auVar91._4_4_ | (uint)!bVar15 * auVar148._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        fVar137 = (float)((uint)bVar15 * auVar91._8_4_ | (uint)!bVar15 * auVar148._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        fVar139 = (float)((uint)bVar15 * auVar91._12_4_ | (uint)!bVar15 * auVar148._12_4_);
        auVar101 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar137,CONCAT44(fVar135,fVar154))));
        auVar119._0_4_ =
             (float)((uint)(bVar14 & 1) * auVar112._0_4_ |
                    (uint)!(bool)(bVar14 & 1) * auVar156._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar15 * auVar112._4_4_ | (uint)!bVar15 * auVar156._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar15 * auVar112._8_4_ | (uint)!bVar15 * auVar156._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar15 * auVar112._12_4_ | (uint)!bVar15 * auVar156._12_4_);
        fVar162 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar112._16_4_);
        auVar119._16_4_ = fVar162;
        fVar147 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar112._20_4_);
        auVar119._20_4_ = fVar147;
        fVar167 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar112._24_4_);
        auVar119._24_4_ = fVar167;
        iVar1 = (uint)(byte)(uVar79 >> 7) * auVar112._28_4_;
        auVar119._28_4_ = iVar1;
        auVar114 = vblendmps_avx512vl(ZEXT1632(auVar94),auVar111);
        auVar120._0_4_ =
             (uint)(bVar14 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar7._0_4_;
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar15 * auVar114._4_4_ | (uint)!bVar15 * auVar7._4_4_;
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar15 * auVar114._8_4_ | (uint)!bVar15 * auVar7._8_4_;
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar15 * auVar114._12_4_ | (uint)!bVar15 * auVar7._12_4_;
        auVar120._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar114._16_4_;
        auVar120._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar114._20_4_;
        auVar120._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar114._24_4_;
        auVar120._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar114._28_4_;
        auVar114 = vblendmps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar195));
        auVar121._0_4_ =
             (float)((uint)(bVar14 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar91._0_4_
                    );
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar15 * auVar114._4_4_ | (uint)!bVar15 * auVar91._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar15 * auVar114._8_4_ | (uint)!bVar15 * auVar91._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar15 * auVar114._12_4_ | (uint)!bVar15 * auVar91._12_4_);
        fVar168 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar114._16_4_);
        auVar121._16_4_ = fVar168;
        fVar169 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar114._20_4_);
        auVar121._20_4_ = fVar169;
        fVar161 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar114._24_4_);
        auVar121._24_4_ = fVar161;
        auVar121._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar114._28_4_;
        auVar114 = vblendmps_avx512vl(auVar105,ZEXT1632(auVar6));
        auVar122._0_4_ =
             (float)((uint)(bVar14 & 1) * auVar114._0_4_ |
                    (uint)!(bool)(bVar14 & 1) * auVar112._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar15 * auVar114._4_4_ | (uint)!bVar15 * auVar112._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar15 * auVar114._8_4_ | (uint)!bVar15 * auVar112._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar15 * auVar114._12_4_ | (uint)!bVar15 * auVar112._12_4_);
        bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar15 * auVar114._16_4_ | (uint)!bVar15 * auVar112._16_4_);
        bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar15 * auVar114._20_4_ | (uint)!bVar15 * auVar112._20_4_);
        bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar15 * auVar114._24_4_ | (uint)!bVar15 * auVar112._24_4_);
        bVar15 = SUB81(uVar79 >> 7,0);
        auVar122._28_4_ = (uint)bVar15 * auVar114._28_4_ | (uint)!bVar15 * auVar112._28_4_;
        auVar123._0_4_ =
             (uint)(bVar14 & 1) * (int)auVar94._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar111._0_4_;
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar15 * (int)auVar94._4_4_ | (uint)!bVar15 * auVar111._4_4_;
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar15 * (int)auVar94._8_4_ | (uint)!bVar15 * auVar111._8_4_;
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar15 * (int)auVar94._12_4_ | (uint)!bVar15 * auVar111._12_4_;
        auVar123._16_4_ = (uint)!(bool)((byte)(uVar79 >> 4) & 1) * auVar111._16_4_;
        auVar123._20_4_ = (uint)!(bool)((byte)(uVar79 >> 5) & 1) * auVar111._20_4_;
        auVar123._24_4_ = (uint)!(bool)((byte)(uVar79 >> 6) & 1) * auVar111._24_4_;
        auVar123._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar111._28_4_;
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar124._0_4_ =
             (uint)(bVar14 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar6._0_4_;
        bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar16 * auVar105._4_4_ | (uint)!bVar16 * auVar6._4_4_;
        bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar16 * auVar105._8_4_ | (uint)!bVar16 * auVar6._8_4_;
        bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar16 * auVar105._12_4_ | (uint)!bVar16 * auVar6._12_4_;
        auVar124._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar105._16_4_;
        auVar124._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar105._20_4_;
        auVar124._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar105._24_4_;
        iVar2 = (uint)(byte)(uVar79 >> 7) * auVar105._28_4_;
        auVar124._28_4_ = iVar2;
        auVar97 = vsubps_avx512vl(auVar123,auVar110);
        auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar95._12_4_ |
                                                 (uint)!bVar18 * auVar195._12_4_,
                                                 CONCAT48((uint)bVar17 * (int)auVar95._8_4_ |
                                                          (uint)!bVar17 * auVar195._8_4_,
                                                          CONCAT44((uint)bVar15 * (int)auVar95._4_4_
                                                                   | (uint)!bVar15 * auVar195._4_4_,
                                                                   (uint)(bVar14 & 1) *
                                                                   (int)auVar95._0_4_ |
                                                                   (uint)!(bool)(bVar14 & 1) *
                                                                   auVar195._0_4_)))),auVar101);
        auVar112 = vsubps_avx(auVar124,auVar119);
        auVar111 = vsubps_avx(auVar110,auVar120);
        auVar105 = vsubps_avx(auVar101,auVar121);
        auVar106 = vsubps_avx(auVar119,auVar122);
        auVar43._4_4_ = auVar112._4_4_ * fVar134;
        auVar43._0_4_ = auVar112._0_4_ * fVar90;
        auVar43._8_4_ = auVar112._8_4_ * fVar136;
        auVar43._12_4_ = auVar112._12_4_ * fVar138;
        auVar43._16_4_ = auVar112._16_4_ * 0.0;
        auVar43._20_4_ = auVar112._20_4_ * 0.0;
        auVar43._24_4_ = auVar112._24_4_ * 0.0;
        auVar43._28_4_ = iVar2;
        auVar93 = vfmsub231ps_fma(auVar43,auVar119,auVar97);
        auVar44._4_4_ = fVar135 * auVar97._4_4_;
        auVar44._0_4_ = fVar154 * auVar97._0_4_;
        auVar44._8_4_ = fVar137 * auVar97._8_4_;
        auVar44._12_4_ = fVar139 * auVar97._12_4_;
        auVar44._16_4_ = auVar97._16_4_ * 0.0;
        auVar44._20_4_ = auVar97._20_4_ * 0.0;
        auVar44._24_4_ = auVar97._24_4_ * 0.0;
        auVar44._28_4_ = auVar113._28_4_;
        auVar91 = vfmsub231ps_fma(auVar44,auVar110,auVar114);
        auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar108,ZEXT1632(auVar93));
        auVar163._0_4_ = auVar114._0_4_ * auVar119._0_4_;
        auVar163._4_4_ = auVar114._4_4_ * auVar119._4_4_;
        auVar163._8_4_ = auVar114._8_4_ * auVar119._8_4_;
        auVar163._12_4_ = auVar114._12_4_ * auVar119._12_4_;
        auVar163._16_4_ = auVar114._16_4_ * fVar162;
        auVar163._20_4_ = auVar114._20_4_ * fVar147;
        auVar163._24_4_ = auVar114._24_4_ * fVar167;
        auVar163._28_4_ = 0;
        auVar93 = vfmsub231ps_fma(auVar163,auVar101,auVar112);
        auVar98 = vfmadd231ps_avx512vl(auVar113,auVar108,ZEXT1632(auVar93));
        auVar113 = vmulps_avx512vl(auVar106,auVar120);
        auVar113 = vfmsub231ps_avx512vl(auVar113,auVar111,auVar122);
        auVar45._4_4_ = auVar105._4_4_ * auVar122._4_4_;
        auVar45._0_4_ = auVar105._0_4_ * auVar122._0_4_;
        auVar45._8_4_ = auVar105._8_4_ * auVar122._8_4_;
        auVar45._12_4_ = auVar105._12_4_ * auVar122._12_4_;
        auVar45._16_4_ = auVar105._16_4_ * auVar122._16_4_;
        auVar45._20_4_ = auVar105._20_4_ * auVar122._20_4_;
        auVar45._24_4_ = auVar105._24_4_ * auVar122._24_4_;
        auVar45._28_4_ = auVar122._28_4_;
        auVar93 = vfmsub231ps_fma(auVar45,auVar121,auVar106);
        auVar164._0_4_ = auVar121._0_4_ * auVar111._0_4_;
        auVar164._4_4_ = auVar121._4_4_ * auVar111._4_4_;
        auVar164._8_4_ = auVar121._8_4_ * auVar111._8_4_;
        auVar164._12_4_ = auVar121._12_4_ * auVar111._12_4_;
        auVar164._16_4_ = fVar168 * auVar111._16_4_;
        auVar164._20_4_ = fVar169 * auVar111._20_4_;
        auVar164._24_4_ = fVar161 * auVar111._24_4_;
        auVar164._28_4_ = 0;
        auVar91 = vfmsub231ps_fma(auVar164,auVar105,auVar120);
        auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar108,auVar113);
        auVar99 = vfmadd231ps_avx512vl(auVar113,auVar108,ZEXT1632(auVar93));
        auVar113 = vmaxps_avx(auVar98,auVar99);
        uVar80 = vcmpps_avx512vl(auVar113,auVar108,2);
        local_310 = local_310 & (byte)uVar80;
        in_ZMM20 = ZEXT3264(local_480);
        in_ZMM21 = ZEXT3264(local_4a0);
        auVar194 = ZEXT3264(local_440);
        auVar192 = ZEXT3264(local_540);
        auVar189 = ZEXT1664(_local_3e0);
        if (local_310 == 0) {
          local_310 = 0;
          auVar176 = ZEXT3264(auVar103);
          auVar153 = ZEXT3264(auVar104);
        }
        else {
          auVar46._4_4_ = auVar106._4_4_ * auVar114._4_4_;
          auVar46._0_4_ = auVar106._0_4_ * auVar114._0_4_;
          auVar46._8_4_ = auVar106._8_4_ * auVar114._8_4_;
          auVar46._12_4_ = auVar106._12_4_ * auVar114._12_4_;
          auVar46._16_4_ = auVar106._16_4_ * auVar114._16_4_;
          auVar46._20_4_ = auVar106._20_4_ * auVar114._20_4_;
          auVar46._24_4_ = auVar106._24_4_ * auVar114._24_4_;
          auVar46._28_4_ = auVar113._28_4_;
          auVar195 = vfmsub231ps_fma(auVar46,auVar105,auVar112);
          auVar47._4_4_ = auVar112._4_4_ * auVar111._4_4_;
          auVar47._0_4_ = auVar112._0_4_ * auVar111._0_4_;
          auVar47._8_4_ = auVar112._8_4_ * auVar111._8_4_;
          auVar47._12_4_ = auVar112._12_4_ * auVar111._12_4_;
          auVar47._16_4_ = auVar112._16_4_ * auVar111._16_4_;
          auVar47._20_4_ = auVar112._20_4_ * auVar111._20_4_;
          auVar47._24_4_ = auVar112._24_4_ * auVar111._24_4_;
          auVar47._28_4_ = auVar112._28_4_;
          auVar91 = vfmsub231ps_fma(auVar47,auVar97,auVar106);
          auVar48._4_4_ = auVar105._4_4_ * auVar97._4_4_;
          auVar48._0_4_ = auVar105._0_4_ * auVar97._0_4_;
          auVar48._8_4_ = auVar105._8_4_ * auVar97._8_4_;
          auVar48._12_4_ = auVar105._12_4_ * auVar97._12_4_;
          auVar48._16_4_ = auVar105._16_4_ * auVar97._16_4_;
          auVar48._20_4_ = auVar105._20_4_ * auVar97._20_4_;
          auVar48._24_4_ = auVar105._24_4_ * auVar97._24_4_;
          auVar48._28_4_ = auVar105._28_4_;
          auVar6 = vfmsub231ps_fma(auVar48,auVar111,auVar114);
          auVar93 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar6));
          auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar195),auVar108);
          auVar114 = vrcp14ps_avx512vl(auVar113);
          auVar24._8_4_ = 0x3f800000;
          auVar24._0_8_ = &DAT_3f8000003f800000;
          auVar24._12_4_ = 0x3f800000;
          auVar24._16_4_ = 0x3f800000;
          auVar24._20_4_ = 0x3f800000;
          auVar24._24_4_ = 0x3f800000;
          auVar24._28_4_ = 0x3f800000;
          auVar112 = vfnmadd213ps_avx512vl(auVar114,auVar113,auVar24);
          auVar93 = vfmadd132ps_fma(auVar112,auVar114,auVar114);
          auVar49._4_4_ = auVar6._4_4_ * auVar119._4_4_;
          auVar49._0_4_ = auVar6._0_4_ * auVar119._0_4_;
          auVar49._8_4_ = auVar6._8_4_ * auVar119._8_4_;
          auVar49._12_4_ = auVar6._12_4_ * auVar119._12_4_;
          auVar49._16_4_ = fVar162 * 0.0;
          auVar49._20_4_ = fVar147 * 0.0;
          auVar49._24_4_ = fVar167 * 0.0;
          auVar49._28_4_ = iVar1;
          auVar91 = vfmadd231ps_fma(auVar49,auVar101,ZEXT1632(auVar91));
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar110,ZEXT1632(auVar195));
          fVar162 = auVar93._0_4_;
          fVar167 = auVar93._4_4_;
          fVar168 = auVar93._8_4_;
          fVar169 = auVar93._12_4_;
          auVar114 = ZEXT1632(CONCAT412(auVar91._12_4_ * fVar169,
                                        CONCAT48(auVar91._8_4_ * fVar168,
                                                 CONCAT44(auVar91._4_4_ * fVar167,
                                                          auVar91._0_4_ * fVar162))));
          auVar153 = ZEXT3264(auVar114);
          auVar177._4_4_ = fVar155;
          auVar177._0_4_ = fVar155;
          auVar177._8_4_ = fVar155;
          auVar177._12_4_ = fVar155;
          auVar177._16_4_ = fVar155;
          auVar177._20_4_ = fVar155;
          auVar177._24_4_ = fVar155;
          auVar177._28_4_ = fVar155;
          uVar80 = vcmpps_avx512vl(auVar177,auVar114,2);
          fVar147 = ray->tfar;
          auVar25._4_4_ = fVar147;
          auVar25._0_4_ = fVar147;
          auVar25._8_4_ = fVar147;
          auVar25._12_4_ = fVar147;
          auVar25._16_4_ = fVar147;
          auVar25._20_4_ = fVar147;
          auVar25._24_4_ = fVar147;
          auVar25._28_4_ = fVar147;
          uVar22 = vcmpps_avx512vl(auVar114,auVar25,2);
          local_310 = (byte)uVar80 & (byte)uVar22 & local_310;
          if (local_310 == 0) {
            local_310 = 0;
            auVar176 = ZEXT3264(auVar103);
            auVar153 = ZEXT3264(auVar104);
          }
          else {
            uVar80 = vcmpps_avx512vl(auVar113,auVar108,4);
            if ((local_310 & (byte)uVar80) == 0) {
              local_310 = 0;
              auVar176 = ZEXT3264(auVar103);
              auVar153 = ZEXT3264(auVar104);
            }
            else {
              local_310 = local_310 & (byte)uVar80;
              fVar147 = auVar98._0_4_ * fVar162;
              fVar161 = auVar98._4_4_ * fVar167;
              auVar50._4_4_ = fVar161;
              auVar50._0_4_ = fVar147;
              fVar90 = auVar98._8_4_ * fVar168;
              auVar50._8_4_ = fVar90;
              fVar154 = auVar98._12_4_ * fVar169;
              auVar50._12_4_ = fVar154;
              fVar134 = auVar98._16_4_ * 0.0;
              auVar50._16_4_ = fVar134;
              fVar135 = auVar98._20_4_ * 0.0;
              auVar50._20_4_ = fVar135;
              fVar136 = auVar98._24_4_ * 0.0;
              auVar50._24_4_ = fVar136;
              auVar50._28_4_ = auVar98._28_4_;
              fVar162 = auVar99._0_4_ * fVar162;
              fVar167 = auVar99._4_4_ * fVar167;
              auVar51._4_4_ = fVar167;
              auVar51._0_4_ = fVar162;
              fVar168 = auVar99._8_4_ * fVar168;
              auVar51._8_4_ = fVar168;
              fVar169 = auVar99._12_4_ * fVar169;
              auVar51._12_4_ = fVar169;
              fVar137 = auVar99._16_4_ * 0.0;
              auVar51._16_4_ = fVar137;
              fVar138 = auVar99._20_4_ * 0.0;
              auVar51._20_4_ = fVar138;
              fVar139 = auVar99._24_4_ * 0.0;
              auVar51._24_4_ = fVar139;
              auVar51._28_4_ = auVar99._28_4_;
              auVar172._8_4_ = 0x3f800000;
              auVar172._0_8_ = &DAT_3f8000003f800000;
              auVar172._12_4_ = 0x3f800000;
              auVar172._16_4_ = 0x3f800000;
              auVar172._20_4_ = 0x3f800000;
              auVar172._24_4_ = 0x3f800000;
              auVar172._28_4_ = 0x3f800000;
              auVar104 = vsubps_avx(auVar172,auVar50);
              bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar79 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar79 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar79 >> 6) & 1);
              bVar21 = SUB81(uVar79 >> 7,0);
              auVar176 = ZEXT3264(CONCAT428((uint)bVar21 * auVar98._28_4_ |
                                            (uint)!bVar21 * auVar104._28_4_,
                                            CONCAT424((uint)bVar20 * (int)fVar136 |
                                                      (uint)!bVar20 * auVar104._24_4_,
                                                      CONCAT420((uint)bVar19 * (int)fVar135 |
                                                                (uint)!bVar19 * auVar104._20_4_,
                                                                CONCAT416((uint)bVar18 *
                                                                          (int)fVar134 |
                                                                          (uint)!bVar18 *
                                                                          auVar104._16_4_,
                                                                          CONCAT412((uint)bVar17 *
                                                                                    (int)fVar154 |
                                                                                    (uint)!bVar17 *
                                                                                    auVar104._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar16 * (int)fVar90 |
                                                  (uint)!bVar16 * auVar104._8_4_,
                                                  CONCAT44((uint)bVar15 * (int)fVar161 |
                                                           (uint)!bVar15 * auVar104._4_4_,
                                                           (uint)(bVar14 & 1) * (int)fVar147 |
                                                           (uint)!(bool)(bVar14 & 1) *
                                                           auVar104._0_4_))))))));
              auVar104 = vsubps_avx(auVar172,auVar51);
              bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar79 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar79 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar79 >> 6) & 1);
              bVar21 = SUB81(uVar79 >> 7,0);
              local_260._4_4_ = (uint)bVar15 * (int)fVar167 | (uint)!bVar15 * auVar104._4_4_;
              local_260._0_4_ =
                   (uint)(bVar14 & 1) * (int)fVar162 | (uint)!(bool)(bVar14 & 1) * auVar104._0_4_;
              local_260._8_4_ = (uint)bVar16 * (int)fVar168 | (uint)!bVar16 * auVar104._8_4_;
              local_260._12_4_ = (uint)bVar17 * (int)fVar169 | (uint)!bVar17 * auVar104._12_4_;
              local_260._16_4_ = (uint)bVar18 * (int)fVar137 | (uint)!bVar18 * auVar104._16_4_;
              local_260._20_4_ = (uint)bVar19 * (int)fVar138 | (uint)!bVar19 * auVar104._20_4_;
              local_260._24_4_ = (uint)bVar20 * (int)fVar139 | (uint)!bVar20 * auVar104._24_4_;
              local_260._28_4_ = (uint)bVar21 * auVar99._28_4_ | (uint)!bVar21 * auVar104._28_4_;
            }
          }
        }
        auVar181 = ZEXT3264(auVar102);
        auVar178 = ZEXT1664(local_660);
        if (local_310 != 0) {
          auVar104 = vsubps_avx(ZEXT1632(auVar92),auVar107);
          local_600 = auVar176._0_32_;
          auVar93 = vfmadd213ps_fma(auVar104,local_600,auVar107);
          fVar147 = pre->depth_scale;
          auVar26._4_4_ = fVar147;
          auVar26._0_4_ = fVar147;
          auVar26._8_4_ = fVar147;
          auVar26._12_4_ = fVar147;
          auVar26._16_4_ = fVar147;
          auVar26._20_4_ = fVar147;
          auVar26._24_4_ = fVar147;
          auVar26._28_4_ = fVar147;
          auVar104 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar93._12_4_ + auVar93._12_4_,
                                                        CONCAT48(auVar93._8_4_ + auVar93._8_4_,
                                                                 CONCAT44(auVar93._4_4_ +
                                                                          auVar93._4_4_,
                                                                          auVar93._0_4_ +
                                                                          auVar93._0_4_)))),auVar26)
          ;
          local_620 = auVar153._0_32_;
          uVar80 = vcmpps_avx512vl(local_620,auVar104,6);
          local_310 = local_310 & (byte)uVar80;
          if (local_310 != 0) {
            auVar143._8_4_ = 0xbf800000;
            auVar143._0_8_ = 0xbf800000bf800000;
            auVar143._12_4_ = 0xbf800000;
            auVar143._16_4_ = 0xbf800000;
            auVar143._20_4_ = 0xbf800000;
            auVar143._24_4_ = 0xbf800000;
            auVar143._28_4_ = 0xbf800000;
            auVar27._8_4_ = 0x40000000;
            auVar27._0_8_ = 0x4000000040000000;
            auVar27._12_4_ = 0x40000000;
            auVar27._16_4_ = 0x40000000;
            auVar27._20_4_ = 0x40000000;
            auVar27._24_4_ = 0x40000000;
            auVar27._28_4_ = 0x40000000;
            local_3a0 = vfmadd132ps_avx512vl(local_260,auVar143,auVar27);
            local_260 = local_3a0;
            auVar104 = local_260;
            local_360 = 0;
            local_340 = local_3f0._0_8_;
            uStack_338 = local_3f0._8_8_;
            local_330 = local_400._0_8_;
            uStack_328 = local_400._8_8_;
            local_320 = local_410._0_8_;
            uStack_318 = local_410._8_8_;
            if ((pGVar12->mask & ray->mask) != 0) {
              pRVar82 = context->args;
              if ((pRVar82->filter != (RTCFilterFunctionN)0x0) ||
                 (pRVar82 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar82 >> 8),1),
                 pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar147 = 1.0 / auVar186._0_4_;
                local_300[0] = fVar147 * (auVar176._0_4_ + 0.0);
                local_300[1] = fVar147 * (auVar176._4_4_ + 1.0);
                local_300[2] = fVar147 * (auVar176._8_4_ + 2.0);
                local_300[3] = fVar147 * (auVar176._12_4_ + 3.0);
                fStack_2f0 = fVar147 * (auVar176._16_4_ + 4.0);
                fStack_2ec = fVar147 * (auVar176._20_4_ + 5.0);
                fStack_2e8 = fVar147 * (auVar176._24_4_ + 6.0);
                fStack_2e4 = auVar176._28_4_ + 7.0;
                local_260._0_8_ = local_3a0._0_8_;
                local_260._8_8_ = local_3a0._8_8_;
                local_260._16_8_ = local_3a0._16_8_;
                local_260._24_8_ = local_3a0._24_8_;
                local_2e0 = local_260._0_8_;
                uStack_2d8 = local_260._8_8_;
                uStack_2d0 = local_260._16_8_;
                uStack_2c8 = local_260._24_8_;
                local_2c0 = local_620;
                uVar79 = CONCAT71(0,local_310);
                local_4f0 = local_3f0._0_8_;
                uStack_4e8 = local_3f0._8_8_;
                stack0xfffffffffffffb48 = auVar100._8_24_;
                local_4c0._0_8_ = uVar79;
                lVar88 = 0;
                for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                  lVar88 = lVar88 + 1;
                }
                local_500 = local_400._0_4_;
                uStack_4fc = local_400._4_4_;
                uStack_4f8 = local_400._8_8_;
                local_550 = (Geometry *)local_410._0_8_;
                uStack_548 = local_410._8_8_;
                uVar79 = CONCAT71((int7)((ulong)pRVar82 >> 8),1);
                local_678 = ray;
                local_670 = context;
                local_650 = pPVar85;
                local_520 = auVar102;
                local_4e0 = fVar155;
                local_3c0 = local_600;
                local_380 = local_620;
                local_35c = iVar11;
                local_350 = local_660;
                local_260 = auVar104;
                do {
                  auVar195 = auVar196._0_16_;
                  local_580._0_4_ = (int)uVar79;
                  local_5a4 = local_300[lVar88];
                  local_5a0 = *(undefined4 *)((long)&local_2e0 + lVar88 * 4);
                  local_680 = CONCAT44(local_680._4_4_,ray->tfar);
                  local_2a0 = (uint)lVar88;
                  uStack_29c = (undefined4)((ulong)lVar88 >> 0x20);
                  ray->tfar = *(float *)(local_2c0 + lVar88 * 4);
                  local_5e0.context = context->user;
                  fVar162 = 1.0 - local_5a4;
                  fVar147 = fVar162 * fVar162 * -3.0;
                  auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162)),
                                            ZEXT416((uint)(local_5a4 * fVar162)),ZEXT416(0xc0000000)
                                           );
                  auVar91 = vfmsub132ss_fma(ZEXT416((uint)(local_5a4 * fVar162)),
                                            ZEXT416((uint)(local_5a4 * local_5a4)),
                                            ZEXT416(0x40000000));
                  fVar162 = auVar93._0_4_ * 3.0;
                  fVar167 = auVar91._0_4_ * 3.0;
                  fVar168 = local_5a4 * local_5a4 * 3.0;
                  auVar170._0_4_ = fVar168 * (float)local_550;
                  auVar170._4_4_ = fVar168 * local_550._4_4_;
                  auVar170._8_4_ = fVar168 * (float)uStack_548;
                  auVar170._12_4_ = fVar168 * uStack_548._4_4_;
                  auVar149._4_4_ = fVar167;
                  auVar149._0_4_ = fVar167;
                  auVar149._8_4_ = fVar167;
                  auVar149._12_4_ = fVar167;
                  auVar72._4_4_ = uStack_4fc;
                  auVar72._0_4_ = local_500;
                  auVar72._8_8_ = uStack_4f8;
                  auVar93 = vfmadd132ps_fma(auVar149,auVar170,auVar72);
                  auVar157._4_4_ = fVar162;
                  auVar157._0_4_ = fVar162;
                  auVar157._8_4_ = fVar162;
                  auVar157._12_4_ = fVar162;
                  auVar73._8_8_ = uStack_4e8;
                  auVar73._0_8_ = local_4f0;
                  auVar93 = vfmadd132ps_fma(auVar157,auVar93,auVar73);
                  auVar150._4_4_ = fVar147;
                  auVar150._0_4_ = fVar147;
                  auVar150._8_4_ = fVar147;
                  auVar150._12_4_ = fVar147;
                  auVar93 = vfmadd213ps_fma(auVar150,auVar178._0_16_,auVar93);
                  local_5b0 = vmovlps_avx(auVar93);
                  local_5a8 = vextractps_avx(auVar93,2);
                  local_59c = local_664;
                  local_598 = (undefined4)local_628;
                  local_594 = (local_5e0.context)->instID[0];
                  local_590 = (local_5e0.context)->instPrimID[0];
                  local_684 = -1;
                  local_5e0.valid = &local_684;
                  local_5e0.geometryUserPtr = pGVar12->userPtr;
                  local_5e0.hit = (RTCHitN *)&local_5b0;
                  local_5e0.N = 1;
                  local_5e0.ray = (RTCRayN *)ray;
                  if (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d19dd7:
                    fVar147 = auVar189._0_4_;
                    auVar102 = auVar181._0_32_;
                    auVar93 = auVar196._0_16_;
                    p_Var13 = context->args->filter;
                    if (p_Var13 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var13)(&local_5e0);
                        auVar189 = ZEXT1664(_local_3e0);
                        auVar181 = ZEXT3264(local_520);
                        auVar192 = ZEXT3264(local_540);
                        auVar193 = ZEXT3264(local_460);
                        auVar194 = ZEXT3264(local_440);
                        auVar178 = ZEXT1664(local_660);
                        in_ZMM21 = ZEXT3264(local_4a0);
                        in_ZMM20 = ZEXT3264(local_480);
                        auVar93 = vxorps_avx512vl(auVar93,auVar93);
                        auVar196 = ZEXT1664(auVar93);
                        context = local_670;
                        ray = local_678;
                        pre = local_648;
                        pPVar85 = local_650;
                        fVar155 = local_4e0;
                      }
                      fVar147 = auVar189._0_4_;
                      auVar102 = auVar181._0_32_;
                      if (*local_5e0.valid == 0) goto LAB_01d19e8c;
                    }
                    uVar79 = (ulong)(uint)local_580._0_4_;
                    break;
                  }
                  (*pGVar12->occlusionFilterN)(&local_5e0);
                  auVar189 = ZEXT1664(_local_3e0);
                  auVar181 = ZEXT3264(local_520);
                  auVar192 = ZEXT3264(local_540);
                  auVar193 = ZEXT3264(local_460);
                  auVar194 = ZEXT3264(local_440);
                  auVar178 = ZEXT1664(local_660);
                  in_ZMM21 = ZEXT3264(local_4a0);
                  in_ZMM20 = ZEXT3264(local_480);
                  auVar93 = vxorps_avx512vl(auVar195,auVar195);
                  auVar196 = ZEXT1664(auVar93);
                  context = local_670;
                  ray = local_678;
                  pre = local_648;
                  pPVar85 = local_650;
                  fVar155 = local_4e0;
                  if (*local_5e0.valid != 0) goto LAB_01d19dd7;
LAB_01d19e8c:
                  auVar102 = auVar181._0_32_;
                  ray->tfar = (float)local_680;
                  uVar83 = local_4c0._0_8_ ^ 1L << ((ulong)local_2a0 & 0x3f);
                  local_4c0._0_8_ = uVar83;
                  lVar88 = 0;
                  for (uVar79 = uVar83; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000
                      ) {
                    lVar88 = lVar88 + 1;
                  }
                  uVar79 = CONCAT71((int7)(uVar83 >> 8),uVar83 != 0);
                  fVar147 = auVar189._0_4_;
                } while (uVar83 != 0);
                local_4e0 = fVar147;
                pRVar82 = (RTCIntersectArguments *)(uVar79 & 0xffffffffffffff01);
                auVar176 = ZEXT3264(local_600);
                auVar153 = ZEXT3264(local_620);
              }
              goto LAB_01d19f11;
            }
          }
        }
        pRVar82 = (RTCIntersectArguments *)0x0;
      }
LAB_01d19f11:
      local_670 = context;
      local_678 = ray;
      local_650 = pPVar85;
      if (8 < iVar11) {
        _local_4c0 = vpbroadcastd_avx512vl();
        local_2a0 = (uint)fVar155;
        uStack_29c = fVar155;
        uStack_298 = fVar155;
        uStack_294 = fVar155;
        uStack_290 = fVar155;
        uStack_28c = fVar155;
        uStack_288 = fVar155;
        uStack_284 = fVar155;
        fStack_3d0 = 1.0 / (float)local_640._0_4_;
        local_3e0._4_4_ = fStack_3d0;
        local_3e0._0_4_ = fStack_3d0;
        fStack_3d8 = fStack_3d0;
        fStack_3d4 = fStack_3d0;
        lVar88 = 8;
        local_600 = auVar176._0_32_;
        local_620 = auVar153._0_32_;
        pRVar84 = pRVar82;
        local_520 = auVar102;
        fStack_4dc = local_4e0;
        fStack_4d8 = local_4e0;
        fStack_4d4 = local_4e0;
        fStack_4d0 = local_4e0;
        fStack_4cc = local_4e0;
        fStack_4c8 = local_4e0;
        fStack_4c4 = local_4e0;
        fStack_3cc = fStack_3d0;
        fStack_3c8 = fStack_3d0;
        fStack_3c4 = fStack_3d0;
        do {
          local_580._0_4_ = (int)pRVar84;
          auVar104 = vpbroadcastd_avx512vl();
          auVar112 = vpor_avx2(auVar104,_DAT_0205a920);
          uVar22 = vpcmpd_avx512vl(auVar112,_local_4c0,1);
          auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 * 4 + lVar23);
          auVar103 = *(undefined1 (*) [32])(lVar23 + 0x2227768 + lVar88 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar23 + 0x2227bec + lVar88 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar23 + 0x2228070 + lVar88 * 4);
          auVar111 = vmulps_avx512vl(local_e0,auVar114);
          auVar105 = vmulps_avx512vl(local_100,auVar114);
          auVar52._4_4_ = auVar114._4_4_ * (float)local_180._4_4_;
          auVar52._0_4_ = auVar114._0_4_ * (float)local_180._0_4_;
          auVar52._8_4_ = auVar114._8_4_ * fStack_178;
          auVar52._12_4_ = auVar114._12_4_ * fStack_174;
          auVar52._16_4_ = auVar114._16_4_ * fStack_170;
          auVar52._20_4_ = auVar114._20_4_ * fStack_16c;
          auVar52._24_4_ = auVar114._24_4_ * fStack_168;
          auVar52._28_4_ = auVar112._28_4_;
          auVar112 = vfmadd231ps_avx512vl(auVar111,auVar113,local_a0);
          auVar111 = vfmadd231ps_avx512vl(auVar105,auVar113,local_c0);
          auVar105 = vfmadd231ps_avx512vl(auVar52,auVar113,local_160);
          auVar109 = auVar192._0_32_;
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar103,auVar109);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar103,local_200);
          auVar93 = vfmadd231ps_fma(auVar105,auVar103,local_140);
          auVar175 = auVar194._0_32_;
          auVar102 = vfmadd231ps_avx512vl(auVar112,auVar104,auVar175);
          auVar174 = auVar193._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar111,auVar104,auVar174);
          auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 * 4 + lVar23);
          auVar111 = *(undefined1 (*) [32])(lVar23 + 0x2229b88 + lVar88 * 4);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar104,local_120);
          auVar105 = *(undefined1 (*) [32])(lVar23 + 0x222a00c + lVar88 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar23 + 0x222a490 + lVar88 * 4);
          auVar110 = vmulps_avx512vl(local_e0,auVar106);
          auVar101 = vmulps_avx512vl(local_100,auVar106);
          auVar53._4_4_ = auVar106._4_4_ * (float)local_180._4_4_;
          auVar53._0_4_ = auVar106._0_4_ * (float)local_180._0_4_;
          auVar53._8_4_ = auVar106._8_4_ * fStack_178;
          auVar53._12_4_ = auVar106._12_4_ * fStack_174;
          auVar53._16_4_ = auVar106._16_4_ * fStack_170;
          auVar53._20_4_ = auVar106._20_4_ * fStack_16c;
          auVar53._24_4_ = auVar106._24_4_ * fStack_168;
          auVar53._28_4_ = uStack_164;
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar105,local_a0);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,local_c0);
          auVar98 = vfmadd231ps_avx512vl(auVar53,auVar105,local_160);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar111,auVar109);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar111,local_200);
          auVar91 = vfmadd231ps_fma(auVar98,auVar111,local_140);
          auVar98 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar175);
          auVar99 = vfmadd231ps_avx512vl(auVar101,auVar112,auVar174);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar112,local_120);
          auVar100 = vmaxps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar91));
          auVar110 = vsubps_avx(auVar98,auVar102);
          auVar101 = vsubps_avx(auVar99,auVar97);
          auVar107 = vmulps_avx512vl(auVar97,auVar110);
          auVar108 = vmulps_avx512vl(auVar102,auVar101);
          auVar107 = vsubps_avx512vl(auVar107,auVar108);
          auVar108 = vmulps_avx512vl(auVar101,auVar101);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar110);
          auVar100 = vmulps_avx512vl(auVar100,auVar100);
          auVar100 = vmulps_avx512vl(auVar100,auVar108);
          auVar107 = vmulps_avx512vl(auVar107,auVar107);
          uVar80 = vcmpps_avx512vl(auVar107,auVar100,2);
          local_310 = (byte)uVar22 & (byte)uVar80;
          if (local_310 == 0) {
            auVar192 = ZEXT3264(auVar109);
LAB_01d1a9db:
            auVar176 = ZEXT3264(local_600);
            auVar153 = ZEXT3264(local_620);
            auVar189 = ZEXT3264(auVar174);
            pRVar82 = (RTCIntersectArguments *)((ulong)pRVar84 & 0xffffffff);
          }
          else {
            auVar106 = vmulps_avx512vl(local_520,auVar106);
            auVar105 = vfmadd213ps_avx512vl(auVar105,local_1e0,auVar106);
            auVar111 = vfmadd213ps_avx512vl(auVar111,local_1c0,auVar105);
            auVar112 = vfmadd213ps_avx512vl(auVar112,local_1a0,auVar111);
            auVar114 = vmulps_avx512vl(local_520,auVar114);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_1e0,auVar114);
            auVar103 = vfmadd213ps_avx512vl(auVar103,local_1c0,auVar113);
            auVar111 = vfmadd213ps_avx512vl(auVar104,local_1a0,auVar103);
            auVar104 = *(undefined1 (*) [32])(lVar23 + 0x22284f4 + lVar88 * 4);
            auVar103 = *(undefined1 (*) [32])(lVar23 + 0x2228978 + lVar88 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar23 + 0x2228dfc + lVar88 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar23 + 0x2229280 + lVar88 * 4);
            auVar105 = vmulps_avx512vl(local_e0,auVar114);
            auVar106 = vmulps_avx512vl(local_100,auVar114);
            auVar114 = vmulps_avx512vl(local_520,auVar114);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,local_a0);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar113,local_c0);
            auVar113 = vfmadd231ps_avx512vl(auVar114,local_1e0,auVar113);
            auVar114 = vfmadd231ps_avx512vl(auVar105,auVar103,auVar109);
            auVar105 = vfmadd231ps_avx512vl(auVar106,auVar103,local_200);
            auVar103 = vfmadd231ps_avx512vl(auVar113,local_1c0,auVar103);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar104,auVar175);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar174);
            auVar106 = vfmadd231ps_avx512vl(auVar103,local_1a0,auVar104);
            auVar104 = *(undefined1 (*) [32])(lVar23 + 0x222a914 + lVar88 * 4);
            auVar103 = *(undefined1 (*) [32])(lVar23 + 0x222b21c + lVar88 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar23 + 0x222b6a0 + lVar88 * 4);
            auVar100 = vmulps_avx512vl(local_e0,auVar113);
            auVar107 = vmulps_avx512vl(local_100,auVar113);
            auVar113 = vmulps_avx512vl(local_520,auVar113);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,local_a0);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,local_c0);
            auVar113 = vfmadd231ps_avx512vl(auVar113,local_1e0,auVar103);
            auVar103 = *(undefined1 (*) [32])(lVar23 + 0x222ad98 + lVar88 * 4);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,auVar109);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,local_200);
            auVar103 = vfmadd231ps_avx512vl(auVar113,local_1c0,auVar103);
            auVar113 = vfmadd231ps_avx512vl(auVar100,auVar104,auVar175);
            auVar100 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar174);
            auVar103 = vfmadd231ps_avx512vl(auVar103,local_1a0,auVar104);
            auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar114,auVar107);
            vandps_avx512vl(auVar105,auVar107);
            auVar104 = vmaxps_avx(auVar107,auVar107);
            vandps_avx512vl(auVar106,auVar107);
            auVar104 = vmaxps_avx(auVar104,auVar107);
            auVar74._4_4_ = fStack_4dc;
            auVar74._0_4_ = local_4e0;
            auVar74._8_4_ = fStack_4d8;
            auVar74._12_4_ = fStack_4d4;
            auVar74._16_4_ = fStack_4d0;
            auVar74._20_4_ = fStack_4cc;
            auVar74._24_4_ = fStack_4c8;
            auVar74._28_4_ = fStack_4c4;
            uVar79 = vcmpps_avx512vl(auVar104,auVar74,1);
            bVar15 = (bool)((byte)uVar79 & 1);
            auVar125._0_4_ = (float)((uint)bVar15 * auVar110._0_4_ | (uint)!bVar15 * auVar114._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar125._4_4_ = (float)((uint)bVar15 * auVar110._4_4_ | (uint)!bVar15 * auVar114._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar125._8_4_ = (float)((uint)bVar15 * auVar110._8_4_ | (uint)!bVar15 * auVar114._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar125._12_4_ =
                 (float)((uint)bVar15 * auVar110._12_4_ | (uint)!bVar15 * auVar114._12_4_);
            bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar125._16_4_ =
                 (float)((uint)bVar15 * auVar110._16_4_ | (uint)!bVar15 * auVar114._16_4_);
            bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar125._20_4_ =
                 (float)((uint)bVar15 * auVar110._20_4_ | (uint)!bVar15 * auVar114._20_4_);
            bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar125._24_4_ =
                 (float)((uint)bVar15 * auVar110._24_4_ | (uint)!bVar15 * auVar114._24_4_);
            bVar15 = SUB81(uVar79 >> 7,0);
            auVar125._28_4_ = (uint)bVar15 * auVar110._28_4_ | (uint)!bVar15 * auVar114._28_4_;
            bVar15 = (bool)((byte)uVar79 & 1);
            auVar126._0_4_ = (float)((uint)bVar15 * auVar101._0_4_ | (uint)!bVar15 * auVar105._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar126._4_4_ = (float)((uint)bVar15 * auVar101._4_4_ | (uint)!bVar15 * auVar105._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar126._8_4_ = (float)((uint)bVar15 * auVar101._8_4_ | (uint)!bVar15 * auVar105._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar126._12_4_ =
                 (float)((uint)bVar15 * auVar101._12_4_ | (uint)!bVar15 * auVar105._12_4_);
            bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar126._16_4_ =
                 (float)((uint)bVar15 * auVar101._16_4_ | (uint)!bVar15 * auVar105._16_4_);
            bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar126._20_4_ =
                 (float)((uint)bVar15 * auVar101._20_4_ | (uint)!bVar15 * auVar105._20_4_);
            bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar126._24_4_ =
                 (float)((uint)bVar15 * auVar101._24_4_ | (uint)!bVar15 * auVar105._24_4_);
            bVar15 = SUB81(uVar79 >> 7,0);
            auVar126._28_4_ = (uint)bVar15 * auVar101._28_4_ | (uint)!bVar15 * auVar105._28_4_;
            vandps_avx512vl(auVar113,auVar107);
            vandps_avx512vl(auVar100,auVar107);
            auVar104 = vmaxps_avx(auVar126,auVar126);
            vandps_avx512vl(auVar103,auVar107);
            auVar104 = vmaxps_avx(auVar104,auVar126);
            uVar79 = vcmpps_avx512vl(auVar104,auVar74,1);
            bVar15 = (bool)((byte)uVar79 & 1);
            auVar127._0_4_ = (uint)bVar15 * auVar110._0_4_ | (uint)!bVar15 * auVar113._0_4_;
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar127._4_4_ = (uint)bVar15 * auVar110._4_4_ | (uint)!bVar15 * auVar113._4_4_;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar127._8_4_ = (uint)bVar15 * auVar110._8_4_ | (uint)!bVar15 * auVar113._8_4_;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar127._12_4_ = (uint)bVar15 * auVar110._12_4_ | (uint)!bVar15 * auVar113._12_4_;
            bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar127._16_4_ = (uint)bVar15 * auVar110._16_4_ | (uint)!bVar15 * auVar113._16_4_;
            bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar127._20_4_ = (uint)bVar15 * auVar110._20_4_ | (uint)!bVar15 * auVar113._20_4_;
            bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar127._24_4_ = (uint)bVar15 * auVar110._24_4_ | (uint)!bVar15 * auVar113._24_4_;
            bVar15 = SUB81(uVar79 >> 7,0);
            auVar127._28_4_ = (uint)bVar15 * auVar110._28_4_ | (uint)!bVar15 * auVar113._28_4_;
            bVar15 = (bool)((byte)uVar79 & 1);
            auVar128._0_4_ = (float)((uint)bVar15 * auVar101._0_4_ | (uint)!bVar15 * auVar100._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar15 * auVar101._4_4_ | (uint)!bVar15 * auVar100._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar15 * auVar101._8_4_ | (uint)!bVar15 * auVar100._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar15 * auVar101._12_4_ | (uint)!bVar15 * auVar100._12_4_);
            bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar128._16_4_ =
                 (float)((uint)bVar15 * auVar101._16_4_ | (uint)!bVar15 * auVar100._16_4_);
            bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar128._20_4_ =
                 (float)((uint)bVar15 * auVar101._20_4_ | (uint)!bVar15 * auVar100._20_4_);
            bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar128._24_4_ =
                 (float)((uint)bVar15 * auVar101._24_4_ | (uint)!bVar15 * auVar100._24_4_);
            bVar15 = SUB81(uVar79 >> 7,0);
            auVar128._28_4_ = (uint)bVar15 * auVar101._28_4_ | (uint)!bVar15 * auVar100._28_4_;
            auVar183._8_4_ = 0x80000000;
            auVar183._0_8_ = 0x8000000080000000;
            auVar183._12_4_ = 0x80000000;
            auVar183._16_4_ = 0x80000000;
            auVar183._20_4_ = 0x80000000;
            auVar183._24_4_ = 0x80000000;
            auVar183._28_4_ = 0x80000000;
            auVar104 = vxorps_avx512vl(auVar127,auVar183);
            auVar100 = auVar196._0_32_;
            auVar103 = vfmadd213ps_avx512vl(auVar125,auVar125,auVar100);
            auVar195 = vfmadd231ps_fma(auVar103,auVar126,auVar126);
            auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar195));
            auVar191._8_4_ = 0xbf000000;
            auVar191._0_8_ = 0xbf000000bf000000;
            auVar191._12_4_ = 0xbf000000;
            auVar191._16_4_ = 0xbf000000;
            auVar191._20_4_ = 0xbf000000;
            auVar191._24_4_ = 0xbf000000;
            auVar191._28_4_ = 0xbf000000;
            fVar155 = auVar103._0_4_;
            fVar147 = auVar103._4_4_;
            fVar162 = auVar103._8_4_;
            fVar167 = auVar103._12_4_;
            fVar168 = auVar103._16_4_;
            fVar169 = auVar103._20_4_;
            fVar161 = auVar103._24_4_;
            auVar54._4_4_ = fVar147 * fVar147 * fVar147 * auVar195._4_4_ * -0.5;
            auVar54._0_4_ = fVar155 * fVar155 * fVar155 * auVar195._0_4_ * -0.5;
            auVar54._8_4_ = fVar162 * fVar162 * fVar162 * auVar195._8_4_ * -0.5;
            auVar54._12_4_ = fVar167 * fVar167 * fVar167 * auVar195._12_4_ * -0.5;
            auVar54._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
            auVar54._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
            auVar54._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
            auVar54._28_4_ = auVar126._28_4_;
            auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar103 = vfmadd231ps_avx512vl(auVar54,auVar113,auVar103);
            auVar55._4_4_ = auVar126._4_4_ * auVar103._4_4_;
            auVar55._0_4_ = auVar126._0_4_ * auVar103._0_4_;
            auVar55._8_4_ = auVar126._8_4_ * auVar103._8_4_;
            auVar55._12_4_ = auVar126._12_4_ * auVar103._12_4_;
            auVar55._16_4_ = auVar126._16_4_ * auVar103._16_4_;
            auVar55._20_4_ = auVar126._20_4_ * auVar103._20_4_;
            auVar55._24_4_ = auVar126._24_4_ * auVar103._24_4_;
            auVar55._28_4_ = 0;
            auVar56._4_4_ = auVar103._4_4_ * -auVar125._4_4_;
            auVar56._0_4_ = auVar103._0_4_ * -auVar125._0_4_;
            auVar56._8_4_ = auVar103._8_4_ * -auVar125._8_4_;
            auVar56._12_4_ = auVar103._12_4_ * -auVar125._12_4_;
            auVar56._16_4_ = auVar103._16_4_ * -auVar125._16_4_;
            auVar56._20_4_ = auVar103._20_4_ * -auVar125._20_4_;
            auVar56._24_4_ = auVar103._24_4_ * -auVar125._24_4_;
            auVar56._28_4_ = auVar126._28_4_;
            auVar114 = vmulps_avx512vl(auVar103,auVar100);
            auVar103 = vfmadd213ps_avx512vl(auVar127,auVar127,auVar100);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar128,auVar128);
            auVar105 = vrsqrt14ps_avx512vl(auVar103);
            auVar103 = vmulps_avx512vl(auVar103,auVar191);
            fVar155 = auVar105._0_4_;
            fVar147 = auVar105._4_4_;
            fVar162 = auVar105._8_4_;
            fVar167 = auVar105._12_4_;
            fVar168 = auVar105._16_4_;
            fVar169 = auVar105._20_4_;
            fVar161 = auVar105._24_4_;
            auVar57._4_4_ = fVar147 * fVar147 * fVar147 * auVar103._4_4_;
            auVar57._0_4_ = fVar155 * fVar155 * fVar155 * auVar103._0_4_;
            auVar57._8_4_ = fVar162 * fVar162 * fVar162 * auVar103._8_4_;
            auVar57._12_4_ = fVar167 * fVar167 * fVar167 * auVar103._12_4_;
            auVar57._16_4_ = fVar168 * fVar168 * fVar168 * auVar103._16_4_;
            auVar57._20_4_ = fVar169 * fVar169 * fVar169 * auVar103._20_4_;
            auVar57._24_4_ = fVar161 * fVar161 * fVar161 * auVar103._24_4_;
            auVar57._28_4_ = auVar103._28_4_;
            auVar103 = vfmadd231ps_avx512vl(auVar57,auVar113,auVar105);
            auVar58._4_4_ = auVar128._4_4_ * auVar103._4_4_;
            auVar58._0_4_ = auVar128._0_4_ * auVar103._0_4_;
            auVar58._8_4_ = auVar128._8_4_ * auVar103._8_4_;
            auVar58._12_4_ = auVar128._12_4_ * auVar103._12_4_;
            auVar58._16_4_ = auVar128._16_4_ * auVar103._16_4_;
            auVar58._20_4_ = auVar128._20_4_ * auVar103._20_4_;
            auVar58._24_4_ = auVar128._24_4_ * auVar103._24_4_;
            auVar58._28_4_ = auVar105._28_4_;
            auVar59._4_4_ = auVar103._4_4_ * auVar104._4_4_;
            auVar59._0_4_ = auVar103._0_4_ * auVar104._0_4_;
            auVar59._8_4_ = auVar103._8_4_ * auVar104._8_4_;
            auVar59._12_4_ = auVar103._12_4_ * auVar104._12_4_;
            auVar59._16_4_ = auVar103._16_4_ * auVar104._16_4_;
            auVar59._20_4_ = auVar103._20_4_ * auVar104._20_4_;
            auVar59._24_4_ = auVar103._24_4_ * auVar104._24_4_;
            auVar59._28_4_ = auVar104._28_4_;
            auVar104 = vmulps_avx512vl(auVar103,auVar100);
            auVar195 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar93),auVar102);
            auVar103 = ZEXT1632(auVar93);
            auVar6 = vfmadd213ps_fma(auVar56,auVar103,auVar97);
            auVar113 = vfmadd213ps_avx512vl(auVar114,auVar103,auVar111);
            auVar105 = vfmadd213ps_avx512vl(auVar58,ZEXT1632(auVar91),auVar98);
            auVar94 = vfnmadd213ps_fma(auVar55,auVar103,auVar102);
            auVar106 = ZEXT1632(auVar91);
            auVar7 = vfmadd213ps_fma(auVar59,auVar106,auVar99);
            auVar95 = vfnmadd213ps_fma(auVar56,auVar103,auVar97);
            auVar8 = vfmadd213ps_fma(auVar104,auVar106,auVar112);
            auVar97 = ZEXT1632(auVar93);
            auVar96 = vfnmadd231ps_fma(auVar111,auVar97,auVar114);
            auVar148 = vfnmadd213ps_fma(auVar58,auVar106,auVar98);
            auVar156 = vfnmadd213ps_fma(auVar59,auVar106,auVar99);
            auVar179 = vfnmadd231ps_fma(auVar112,ZEXT1632(auVar91),auVar104);
            auVar112 = vsubps_avx512vl(auVar105,ZEXT1632(auVar94));
            auVar104 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar95));
            auVar103 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar96));
            auVar60._4_4_ = auVar104._4_4_ * auVar96._4_4_;
            auVar60._0_4_ = auVar104._0_4_ * auVar96._0_4_;
            auVar60._8_4_ = auVar104._8_4_ * auVar96._8_4_;
            auVar60._12_4_ = auVar104._12_4_ * auVar96._12_4_;
            auVar60._16_4_ = auVar104._16_4_ * 0.0;
            auVar60._20_4_ = auVar104._20_4_ * 0.0;
            auVar60._24_4_ = auVar104._24_4_ * 0.0;
            auVar60._28_4_ = auVar114._28_4_;
            auVar93 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar95),auVar103);
            auVar61._4_4_ = auVar103._4_4_ * auVar94._4_4_;
            auVar61._0_4_ = auVar103._0_4_ * auVar94._0_4_;
            auVar61._8_4_ = auVar103._8_4_ * auVar94._8_4_;
            auVar61._12_4_ = auVar103._12_4_ * auVar94._12_4_;
            auVar61._16_4_ = auVar103._16_4_ * 0.0;
            auVar61._20_4_ = auVar103._20_4_ * 0.0;
            auVar61._24_4_ = auVar103._24_4_ * 0.0;
            auVar61._28_4_ = auVar103._28_4_;
            auVar9 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar96),auVar112);
            auVar62._4_4_ = auVar95._4_4_ * auVar112._4_4_;
            auVar62._0_4_ = auVar95._0_4_ * auVar112._0_4_;
            auVar62._8_4_ = auVar95._8_4_ * auVar112._8_4_;
            auVar62._12_4_ = auVar95._12_4_ * auVar112._12_4_;
            auVar62._16_4_ = auVar112._16_4_ * 0.0;
            auVar62._20_4_ = auVar112._20_4_ * 0.0;
            auVar62._24_4_ = auVar112._24_4_ * 0.0;
            auVar62._28_4_ = auVar112._28_4_;
            auVar92 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar94),auVar104);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar100,ZEXT1632(auVar9));
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar100,ZEXT1632(auVar93));
            uVar79 = vcmpps_avx512vl(auVar104,auVar100,2);
            bVar14 = (byte)uVar79;
            fVar134 = (float)((uint)(bVar14 & 1) * auVar195._0_4_ |
                             (uint)!(bool)(bVar14 & 1) * auVar148._0_4_);
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            fVar136 = (float)((uint)bVar15 * auVar195._4_4_ | (uint)!bVar15 * auVar148._4_4_);
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            fVar138 = (float)((uint)bVar15 * auVar195._8_4_ | (uint)!bVar15 * auVar148._8_4_);
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            fVar140 = (float)((uint)bVar15 * auVar195._12_4_ | (uint)!bVar15 * auVar148._12_4_);
            auVar106 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar138,CONCAT44(fVar136,fVar134))));
            fVar135 = (float)((uint)(bVar14 & 1) * auVar6._0_4_ |
                             (uint)!(bool)(bVar14 & 1) * auVar156._0_4_);
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            fVar137 = (float)((uint)bVar15 * auVar6._4_4_ | (uint)!bVar15 * auVar156._4_4_);
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            fVar139 = (float)((uint)bVar15 * auVar6._8_4_ | (uint)!bVar15 * auVar156._8_4_);
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            fVar141 = (float)((uint)bVar15 * auVar6._12_4_ | (uint)!bVar15 * auVar156._12_4_);
            auVar110 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar139,CONCAT44(fVar137,fVar135))));
            auVar129._0_4_ =
                 (float)((uint)(bVar14 & 1) * auVar113._0_4_ |
                        (uint)!(bool)(bVar14 & 1) * auVar179._0_4_);
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar15 * auVar113._4_4_ | (uint)!bVar15 * auVar179._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar15 * auVar113._8_4_ | (uint)!bVar15 * auVar179._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar15 * auVar113._12_4_ | (uint)!bVar15 * auVar179._12_4_);
            fVar155 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar113._16_4_);
            auVar129._16_4_ = fVar155;
            fVar162 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar113._20_4_);
            auVar129._20_4_ = fVar162;
            fVar147 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar113._24_4_);
            auVar129._24_4_ = fVar147;
            iVar1 = (uint)(byte)(uVar79 >> 7) * auVar113._28_4_;
            auVar129._28_4_ = iVar1;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar94),auVar105);
            auVar130._0_4_ =
                 (uint)(bVar14 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar93._0_4_;
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar130._4_4_ = (uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * auVar93._4_4_;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar130._8_4_ = (uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * auVar93._8_4_;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar130._12_4_ = (uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * auVar93._12_4_;
            auVar130._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar104._16_4_;
            auVar130._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar104._20_4_;
            auVar130._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar104._24_4_;
            auVar130._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar104._28_4_;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar7));
            auVar131._0_4_ =
                 (float)((uint)(bVar14 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar14 & 1) * auVar195._0_4_);
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * auVar195._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * auVar195._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * auVar195._12_4_);
            fVar167 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar104._16_4_);
            auVar131._16_4_ = fVar167;
            fVar169 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar104._20_4_);
            auVar131._20_4_ = fVar169;
            fVar168 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar104._24_4_);
            auVar131._24_4_ = fVar168;
            auVar131._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar104._28_4_;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar8));
            auVar132._0_4_ =
                 (float)((uint)(bVar14 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar14 & 1) * auVar6._0_4_);
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * auVar6._4_4_);
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * auVar6._8_4_);
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * auVar6._12_4_);
            fVar154 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar104._16_4_);
            auVar132._16_4_ = fVar154;
            fVar90 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar104._20_4_);
            auVar132._20_4_ = fVar90;
            fVar161 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar104._24_4_);
            auVar132._24_4_ = fVar161;
            iVar2 = (uint)(byte)(uVar79 >> 7) * auVar104._28_4_;
            auVar132._28_4_ = iVar2;
            auVar133._0_4_ =
                 (uint)(bVar14 & 1) * (int)auVar94._0_4_ |
                 (uint)!(bool)(bVar14 & 1) * auVar105._0_4_;
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar133._4_4_ = (uint)bVar15 * (int)auVar94._4_4_ | (uint)!bVar15 * auVar105._4_4_;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar133._8_4_ = (uint)bVar15 * (int)auVar94._8_4_ | (uint)!bVar15 * auVar105._8_4_;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar133._12_4_ = (uint)bVar15 * (int)auVar94._12_4_ | (uint)!bVar15 * auVar105._12_4_;
            auVar133._16_4_ = (uint)!(bool)((byte)(uVar79 >> 4) & 1) * auVar105._16_4_;
            auVar133._20_4_ = (uint)!(bool)((byte)(uVar79 >> 5) & 1) * auVar105._20_4_;
            auVar133._24_4_ = (uint)!(bool)((byte)(uVar79 >> 6) & 1) * auVar105._24_4_;
            auVar133._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar105._28_4_;
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar79 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar105 = vsubps_avx512vl(auVar133,auVar106);
            auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar95._12_4_ |
                                                     (uint)!bVar19 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar17 * (int)auVar95._8_4_ |
                                                              (uint)!bVar17 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar95._4_4_ |
                                                                       (uint)!bVar15 * auVar7._4_4_,
                                                                       (uint)(bVar14 & 1) *
                                                                       (int)auVar95._0_4_ |
                                                                       (uint)!(bool)(bVar14 & 1) *
                                                                       auVar7._0_4_)))),auVar110);
            auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar96._12_4_ |
                                                     (uint)!bVar20 * auVar8._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar96._8_4_ |
                                                              (uint)!bVar18 * auVar8._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar96._4_4_ |
                                                                       (uint)!bVar16 * auVar8._4_4_,
                                                                       (uint)(bVar14 & 1) *
                                                                       (int)auVar96._0_4_ |
                                                                       (uint)!(bool)(bVar14 & 1) *
                                                                       auVar8._0_4_)))),auVar129);
            auVar114 = vsubps_avx(auVar106,auVar130);
            auVar112 = vsubps_avx(auVar110,auVar131);
            auVar111 = vsubps_avx(auVar129,auVar132);
            auVar63._4_4_ = auVar113._4_4_ * fVar136;
            auVar63._0_4_ = auVar113._0_4_ * fVar134;
            auVar63._8_4_ = auVar113._8_4_ * fVar138;
            auVar63._12_4_ = auVar113._12_4_ * fVar140;
            auVar63._16_4_ = auVar113._16_4_ * 0.0;
            auVar63._20_4_ = auVar113._20_4_ * 0.0;
            auVar63._24_4_ = auVar113._24_4_ * 0.0;
            auVar63._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar63,auVar129,auVar105);
            auVar160._0_4_ = fVar135 * auVar105._0_4_;
            auVar160._4_4_ = fVar137 * auVar105._4_4_;
            auVar160._8_4_ = fVar139 * auVar105._8_4_;
            auVar160._12_4_ = fVar141 * auVar105._12_4_;
            auVar160._16_4_ = auVar105._16_4_ * 0.0;
            auVar160._20_4_ = auVar105._20_4_ * 0.0;
            auVar160._24_4_ = auVar105._24_4_ * 0.0;
            auVar160._28_4_ = 0;
            auVar195 = vfmsub231ps_fma(auVar160,auVar106,auVar103);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar195),auVar100,ZEXT1632(auVar93));
            auVar165._0_4_ = auVar103._0_4_ * auVar129._0_4_;
            auVar165._4_4_ = auVar103._4_4_ * auVar129._4_4_;
            auVar165._8_4_ = auVar103._8_4_ * auVar129._8_4_;
            auVar165._12_4_ = auVar103._12_4_ * auVar129._12_4_;
            auVar165._16_4_ = auVar103._16_4_ * fVar155;
            auVar165._20_4_ = auVar103._20_4_ * fVar162;
            auVar165._24_4_ = auVar103._24_4_ * fVar147;
            auVar165._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar165,auVar110,auVar113);
            auVar101 = vfmadd231ps_avx512vl(auVar104,auVar100,ZEXT1632(auVar93));
            auVar104 = vmulps_avx512vl(auVar111,auVar130);
            auVar104 = vfmsub231ps_avx512vl(auVar104,auVar114,auVar132);
            auVar64._4_4_ = auVar112._4_4_ * auVar132._4_4_;
            auVar64._0_4_ = auVar112._0_4_ * auVar132._0_4_;
            auVar64._8_4_ = auVar112._8_4_ * auVar132._8_4_;
            auVar64._12_4_ = auVar112._12_4_ * auVar132._12_4_;
            auVar64._16_4_ = auVar112._16_4_ * fVar154;
            auVar64._20_4_ = auVar112._20_4_ * fVar90;
            auVar64._24_4_ = auVar112._24_4_ * fVar161;
            auVar64._28_4_ = iVar2;
            auVar93 = vfmsub231ps_fma(auVar64,auVar131,auVar111);
            auVar166._0_4_ = auVar131._0_4_ * auVar114._0_4_;
            auVar166._4_4_ = auVar131._4_4_ * auVar114._4_4_;
            auVar166._8_4_ = auVar131._8_4_ * auVar114._8_4_;
            auVar166._12_4_ = auVar131._12_4_ * auVar114._12_4_;
            auVar166._16_4_ = fVar167 * auVar114._16_4_;
            auVar166._20_4_ = fVar169 * auVar114._20_4_;
            auVar166._24_4_ = fVar168 * auVar114._24_4_;
            auVar166._28_4_ = 0;
            auVar195 = vfmsub231ps_fma(auVar166,auVar112,auVar130);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar195),auVar100,auVar104);
            auVar102 = vfmadd231ps_avx512vl(auVar104,auVar100,ZEXT1632(auVar93));
            auVar104 = vmaxps_avx(auVar101,auVar102);
            uVar80 = vcmpps_avx512vl(auVar104,auVar100,2);
            local_310 = local_310 & (byte)uVar80;
            auVar189 = ZEXT3264(auVar174);
            if (local_310 == 0) {
              local_310 = 0;
            }
            else {
              auVar65._4_4_ = auVar111._4_4_ * auVar103._4_4_;
              auVar65._0_4_ = auVar111._0_4_ * auVar103._0_4_;
              auVar65._8_4_ = auVar111._8_4_ * auVar103._8_4_;
              auVar65._12_4_ = auVar111._12_4_ * auVar103._12_4_;
              auVar65._16_4_ = auVar111._16_4_ * auVar103._16_4_;
              auVar65._20_4_ = auVar111._20_4_ * auVar103._20_4_;
              auVar65._24_4_ = auVar111._24_4_ * auVar103._24_4_;
              auVar65._28_4_ = auVar104._28_4_;
              auVar6 = vfmsub231ps_fma(auVar65,auVar112,auVar113);
              auVar66._4_4_ = auVar113._4_4_ * auVar114._4_4_;
              auVar66._0_4_ = auVar113._0_4_ * auVar114._0_4_;
              auVar66._8_4_ = auVar113._8_4_ * auVar114._8_4_;
              auVar66._12_4_ = auVar113._12_4_ * auVar114._12_4_;
              auVar66._16_4_ = auVar113._16_4_ * auVar114._16_4_;
              auVar66._20_4_ = auVar113._20_4_ * auVar114._20_4_;
              auVar66._24_4_ = auVar113._24_4_ * auVar114._24_4_;
              auVar66._28_4_ = auVar113._28_4_;
              auVar195 = vfmsub231ps_fma(auVar66,auVar105,auVar111);
              auVar67._4_4_ = auVar112._4_4_ * auVar105._4_4_;
              auVar67._0_4_ = auVar112._0_4_ * auVar105._0_4_;
              auVar67._8_4_ = auVar112._8_4_ * auVar105._8_4_;
              auVar67._12_4_ = auVar112._12_4_ * auVar105._12_4_;
              auVar67._16_4_ = auVar112._16_4_ * auVar105._16_4_;
              auVar67._20_4_ = auVar112._20_4_ * auVar105._20_4_;
              auVar67._24_4_ = auVar112._24_4_ * auVar105._24_4_;
              auVar67._28_4_ = auVar112._28_4_;
              auVar7 = vfmsub231ps_fma(auVar67,auVar114,auVar103);
              auVar93 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar195),ZEXT1632(auVar7));
              auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar6),auVar100);
              auVar103 = vrcp14ps_avx512vl(auVar104);
              auVar29._8_4_ = 0x3f800000;
              auVar29._0_8_ = &DAT_3f8000003f800000;
              auVar29._12_4_ = 0x3f800000;
              auVar29._16_4_ = 0x3f800000;
              auVar29._20_4_ = 0x3f800000;
              auVar29._24_4_ = 0x3f800000;
              auVar29._28_4_ = 0x3f800000;
              auVar113 = vfnmadd213ps_avx512vl(auVar103,auVar104,auVar29);
              auVar93 = vfmadd132ps_fma(auVar113,auVar103,auVar103);
              auVar68._4_4_ = auVar7._4_4_ * auVar129._4_4_;
              auVar68._0_4_ = auVar7._0_4_ * auVar129._0_4_;
              auVar68._8_4_ = auVar7._8_4_ * auVar129._8_4_;
              auVar68._12_4_ = auVar7._12_4_ * auVar129._12_4_;
              auVar68._16_4_ = fVar155 * 0.0;
              auVar68._20_4_ = fVar162 * 0.0;
              auVar68._24_4_ = fVar147 * 0.0;
              auVar68._28_4_ = iVar1;
              auVar195 = vfmadd231ps_fma(auVar68,auVar110,ZEXT1632(auVar195));
              auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar106,ZEXT1632(auVar6));
              fVar147 = auVar93._0_4_;
              fVar162 = auVar93._4_4_;
              fVar167 = auVar93._8_4_;
              fVar168 = auVar93._12_4_;
              auVar103 = ZEXT1632(CONCAT412(auVar195._12_4_ * fVar168,
                                            CONCAT48(auVar195._8_4_ * fVar167,
                                                     CONCAT44(auVar195._4_4_ * fVar162,
                                                              auVar195._0_4_ * fVar147))));
              auVar75._4_4_ = uStack_29c;
              auVar75._0_4_ = local_2a0;
              auVar75._8_4_ = uStack_298;
              auVar75._12_4_ = uStack_294;
              auVar75._16_4_ = uStack_290;
              auVar75._20_4_ = uStack_28c;
              auVar75._24_4_ = uStack_288;
              auVar75._28_4_ = uStack_284;
              uVar80 = vcmpps_avx512vl(auVar103,auVar75,0xd);
              fVar155 = local_678->tfar;
              auVar30._4_4_ = fVar155;
              auVar30._0_4_ = fVar155;
              auVar30._8_4_ = fVar155;
              auVar30._12_4_ = fVar155;
              auVar30._16_4_ = fVar155;
              auVar30._20_4_ = fVar155;
              auVar30._24_4_ = fVar155;
              auVar30._28_4_ = fVar155;
              uVar22 = vcmpps_avx512vl(auVar103,auVar30,2);
              local_310 = (byte)uVar80 & (byte)uVar22 & local_310;
              if (local_310 == 0) {
                local_310 = 0;
              }
              else {
                uVar80 = vcmpps_avx512vl(auVar104,auVar100,4);
                if ((local_310 & (byte)uVar80) == 0) {
                  local_310 = 0;
                }
                else {
                  local_310 = local_310 & (byte)uVar80;
                  fVar155 = auVar101._0_4_ * fVar147;
                  fVar169 = auVar101._4_4_ * fVar162;
                  auVar69._4_4_ = fVar169;
                  auVar69._0_4_ = fVar155;
                  fVar161 = auVar101._8_4_ * fVar167;
                  auVar69._8_4_ = fVar161;
                  fVar90 = auVar101._12_4_ * fVar168;
                  auVar69._12_4_ = fVar90;
                  fVar154 = auVar101._16_4_ * 0.0;
                  auVar69._16_4_ = fVar154;
                  fVar134 = auVar101._20_4_ * 0.0;
                  auVar69._20_4_ = fVar134;
                  fVar135 = auVar101._24_4_ * 0.0;
                  auVar69._24_4_ = fVar135;
                  auVar69._28_4_ = auVar101._28_4_;
                  fVar147 = auVar102._0_4_ * fVar147;
                  fVar162 = auVar102._4_4_ * fVar162;
                  auVar70._4_4_ = fVar162;
                  auVar70._0_4_ = fVar147;
                  fVar167 = auVar102._8_4_ * fVar167;
                  auVar70._8_4_ = fVar167;
                  fVar168 = auVar102._12_4_ * fVar168;
                  auVar70._12_4_ = fVar168;
                  fVar136 = auVar102._16_4_ * 0.0;
                  auVar70._16_4_ = fVar136;
                  fVar137 = auVar102._20_4_ * 0.0;
                  auVar70._20_4_ = fVar137;
                  fVar138 = auVar102._24_4_ * 0.0;
                  auVar70._24_4_ = fVar138;
                  auVar70._28_4_ = auVar102._28_4_;
                  auVar173._8_4_ = 0x3f800000;
                  auVar173._0_8_ = &DAT_3f8000003f800000;
                  auVar173._12_4_ = 0x3f800000;
                  auVar173._16_4_ = 0x3f800000;
                  auVar173._20_4_ = 0x3f800000;
                  auVar173._24_4_ = 0x3f800000;
                  auVar173._28_4_ = 0x3f800000;
                  auVar104 = vsubps_avx512vl(auVar173,auVar69);
                  bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
                  bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
                  bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
                  bVar18 = (bool)((byte)(uVar79 >> 4) & 1);
                  bVar19 = (bool)((byte)(uVar79 >> 5) & 1);
                  bVar20 = (bool)((byte)(uVar79 >> 6) & 1);
                  bVar21 = SUB81(uVar79 >> 7,0);
                  in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar21 * auVar101._28_4_ |
                                                (uint)!bVar21 * auVar104._28_4_,
                                                CONCAT424((uint)bVar20 * (int)fVar135 |
                                                          (uint)!bVar20 * auVar104._24_4_,
                                                          CONCAT420((uint)bVar19 * (int)fVar134 |
                                                                    (uint)!bVar19 * auVar104._20_4_,
                                                                    CONCAT416((uint)bVar18 *
                                                                              (int)fVar154 |
                                                                              (uint)!bVar18 *
                                                                              auVar104._16_4_,
                                                                              CONCAT412((uint)bVar17
                                                                                        * (int)
                                                  fVar90 | (uint)!bVar17 * auVar104._12_4_,
                                                  CONCAT48((uint)bVar16 * (int)fVar161 |
                                                           (uint)!bVar16 * auVar104._8_4_,
                                                           CONCAT44((uint)bVar15 * (int)fVar169 |
                                                                    (uint)!bVar15 * auVar104._4_4_,
                                                                    (uint)(bVar14 & 1) *
                                                                    (int)fVar155 |
                                                                    (uint)!(bool)(bVar14 & 1) *
                                                                    auVar104._0_4_))))))));
                  auVar104 = vsubps_avx(auVar173,auVar70);
                  bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
                  bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
                  bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
                  bVar18 = (bool)((byte)(uVar79 >> 4) & 1);
                  bVar19 = (bool)((byte)(uVar79 >> 5) & 1);
                  bVar20 = (bool)((byte)(uVar79 >> 6) & 1);
                  bVar21 = SUB81(uVar79 >> 7,0);
                  local_280._4_4_ = (uint)bVar15 * (int)fVar162 | (uint)!bVar15 * auVar104._4_4_;
                  local_280._0_4_ =
                       (uint)(bVar14 & 1) * (int)fVar147 |
                       (uint)!(bool)(bVar14 & 1) * auVar104._0_4_;
                  local_280._8_4_ = (uint)bVar16 * (int)fVar167 | (uint)!bVar16 * auVar104._8_4_;
                  local_280._12_4_ = (uint)bVar17 * (int)fVar168 | (uint)!bVar17 * auVar104._12_4_;
                  local_280._16_4_ = (uint)bVar18 * (int)fVar136 | (uint)!bVar18 * auVar104._16_4_;
                  local_280._20_4_ = (uint)bVar19 * (int)fVar137 | (uint)!bVar19 * auVar104._20_4_;
                  local_280._24_4_ = (uint)bVar20 * (int)fVar138 | (uint)!bVar20 * auVar104._24_4_;
                  local_280._28_4_ =
                       (uint)bVar21 * auVar102._28_4_ | (uint)!bVar21 * auVar104._28_4_;
                  in_ZMM21 = ZEXT3264(auVar103);
                }
              }
            }
            pRVar82 = (RTCIntersectArguments *)((ulong)pRVar84 & 0xffffffff);
            auVar192 = ZEXT3264(local_540);
            auVar176 = ZEXT3264(local_600);
            auVar153 = ZEXT3264(local_620);
            if (local_310 != 0) {
              auVar104 = vsubps_avx(ZEXT1632(auVar91),auVar97);
              local_480 = in_ZMM20._0_32_;
              auVar104 = vfmadd213ps_avx512vl(auVar104,local_480,auVar97);
              auVar144._0_4_ = auVar104._0_4_ + auVar104._0_4_;
              auVar144._4_4_ = auVar104._4_4_ + auVar104._4_4_;
              auVar144._8_4_ = auVar104._8_4_ + auVar104._8_4_;
              auVar144._12_4_ = auVar104._12_4_ + auVar104._12_4_;
              auVar144._16_4_ = auVar104._16_4_ + auVar104._16_4_;
              auVar144._20_4_ = auVar104._20_4_ + auVar104._20_4_;
              auVar144._24_4_ = auVar104._24_4_ + auVar104._24_4_;
              auVar144._28_4_ = auVar104._28_4_ + auVar104._28_4_;
              fVar155 = pre->depth_scale;
              auVar31._4_4_ = fVar155;
              auVar31._0_4_ = fVar155;
              auVar31._8_4_ = fVar155;
              auVar31._12_4_ = fVar155;
              auVar31._16_4_ = fVar155;
              auVar31._20_4_ = fVar155;
              auVar31._24_4_ = fVar155;
              auVar31._28_4_ = fVar155;
              auVar104 = vmulps_avx512vl(auVar144,auVar31);
              local_4a0 = in_ZMM21._0_32_;
              uVar80 = vcmpps_avx512vl(local_4a0,auVar104,6);
              local_310 = local_310 & (byte)uVar80;
              if (local_310 == 0) goto LAB_01d1a9db;
              auVar145._8_4_ = 0xbf800000;
              auVar145._0_8_ = 0xbf800000bf800000;
              auVar145._12_4_ = 0xbf800000;
              auVar145._16_4_ = 0xbf800000;
              auVar145._20_4_ = 0xbf800000;
              auVar145._24_4_ = 0xbf800000;
              auVar145._28_4_ = 0xbf800000;
              auVar32._8_4_ = 0x40000000;
              auVar32._0_8_ = 0x4000000040000000;
              auVar32._12_4_ = 0x40000000;
              auVar32._16_4_ = 0x40000000;
              auVar32._20_4_ = 0x40000000;
              auVar32._24_4_ = 0x40000000;
              auVar32._28_4_ = 0x40000000;
              local_3a0 = vfmadd132ps_avx512vl(local_280,auVar145,auVar32);
              local_280 = local_3a0;
              auVar104 = local_280;
              local_360 = (undefined4)lVar88;
              local_350 = local_660;
              local_340 = local_3f0._0_8_;
              uStack_338 = local_3f0._8_8_;
              local_330 = local_400._0_8_;
              uStack_328 = local_400._8_8_;
              local_320 = local_410._0_8_;
              uStack_318 = local_410._8_8_;
              local_680 = CONCAT44(local_680._4_4_,(uint)local_310);
              local_550 = (local_670->scene->geometries).items[local_628].ptr;
              if ((local_550->mask & local_678->mask) == 0) {
                auVar78._12_4_ = 0;
                auVar78._0_12_ = local_640._4_12_;
                local_640._0_16_ = auVar78 << 0x20;
              }
              else if ((local_670->args->filter != (RTCFilterFunctionN)0x0) ||
                      (local_640._0_4_ = 1, local_550->occlusionFilterN != (RTCFilterFunctionN)0x0))
              {
                auVar103 = vaddps_avx512vl(local_480,_DAT_02020f40);
                auVar93 = vcvtsi2ss_avx512f(auVar193._0_16_,local_360);
                fVar155 = auVar93._0_4_;
                local_300[0] = (fVar155 + auVar103._0_4_) * (float)local_3e0._0_4_;
                local_300[1] = (fVar155 + auVar103._4_4_) * (float)local_3e0._4_4_;
                local_300[2] = (fVar155 + auVar103._8_4_) * fStack_3d8;
                local_300[3] = (fVar155 + auVar103._12_4_) * fStack_3d4;
                fStack_2f0 = (fVar155 + auVar103._16_4_) * fStack_3d0;
                fStack_2ec = (fVar155 + auVar103._20_4_) * fStack_3cc;
                fStack_2e8 = (fVar155 + auVar103._24_4_) * fStack_3c8;
                fStack_2e4 = fVar155 + auVar103._28_4_;
                local_280._0_8_ = local_3a0._0_8_;
                local_280._8_8_ = local_3a0._8_8_;
                local_280._16_8_ = local_3a0._16_8_;
                local_280._24_8_ = local_3a0._24_8_;
                local_2e0 = local_280._0_8_;
                uStack_2d8 = local_280._8_8_;
                uStack_2d0 = local_280._16_8_;
                uStack_2c8 = local_280._24_8_;
                local_2c0 = local_4a0;
                local_210 = local_3f0._0_8_;
                uStack_208 = local_3f0._8_8_;
                uVar79 = 0;
                uVar81 = (ulong)(uint)local_310;
                for (uVar83 = uVar81; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000)
                {
                  uVar79 = uVar79 + 1;
                }
                local_220 = local_400._0_8_;
                uStack_218 = local_400._8_8_;
                local_230 = local_410._0_8_;
                uStack_228 = local_410._8_8_;
                uVar80 = CONCAT71((int7)((ulong)local_550 >> 8),1);
                local_3c0 = local_480;
                local_380 = local_4a0;
                local_35c = iVar11;
                local_280 = auVar104;
                do {
                  local_640._0_4_ = (int)uVar80;
                  local_5a4 = local_300[uVar79];
                  local_5a0 = *(undefined4 *)((long)&local_2e0 + uVar79 * 4);
                  local_500 = local_678->tfar;
                  local_678->tfar = *(float *)(local_2c0 + uVar79 * 4);
                  local_5e0.context = local_670->user;
                  fVar147 = 1.0 - local_5a4;
                  fVar155 = fVar147 * fVar147 * -3.0;
                  auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147)),
                                            ZEXT416((uint)(local_5a4 * fVar147)),ZEXT416(0xc0000000)
                                           );
                  auVar91 = vfmsub132ss_fma(ZEXT416((uint)(local_5a4 * fVar147)),
                                            ZEXT416((uint)(local_5a4 * local_5a4)),
                                            ZEXT416(0x40000000));
                  fVar147 = auVar93._0_4_ * 3.0;
                  fVar162 = auVar91._0_4_ * 3.0;
                  fVar167 = local_5a4 * local_5a4 * 3.0;
                  auVar171._0_4_ = fVar167 * (float)local_230;
                  auVar171._4_4_ = fVar167 * local_230._4_4_;
                  auVar171._8_4_ = fVar167 * (float)uStack_228;
                  auVar171._12_4_ = fVar167 * uStack_228._4_4_;
                  auVar151._4_4_ = fVar162;
                  auVar151._0_4_ = fVar162;
                  auVar151._8_4_ = fVar162;
                  auVar151._12_4_ = fVar162;
                  auVar76._8_8_ = uStack_218;
                  auVar76._0_8_ = local_220;
                  auVar93 = vfmadd132ps_fma(auVar151,auVar171,auVar76);
                  auVar158._4_4_ = fVar147;
                  auVar158._0_4_ = fVar147;
                  auVar158._8_4_ = fVar147;
                  auVar158._12_4_ = fVar147;
                  auVar77._8_8_ = uStack_208;
                  auVar77._0_8_ = local_210;
                  auVar93 = vfmadd132ps_fma(auVar158,auVar93,auVar77);
                  auVar152._4_4_ = fVar155;
                  auVar152._0_4_ = fVar155;
                  auVar152._8_4_ = fVar155;
                  auVar152._12_4_ = fVar155;
                  auVar93 = vfmadd213ps_fma(auVar152,local_660,auVar93);
                  local_5b0 = vmovlps_avx(auVar93);
                  local_5a8 = vextractps_avx(auVar93,2);
                  local_59c = local_664;
                  local_598 = (undefined4)local_628;
                  local_594 = (local_5e0.context)->instID[0];
                  local_590 = (local_5e0.context)->instPrimID[0];
                  local_684 = -1;
                  local_5e0.valid = &local_684;
                  local_5e0.geometryUserPtr = local_550->userPtr;
                  local_5e0.hit = (RTCHitN *)&local_5b0;
                  local_5e0.N = 1;
                  local_680 = uVar81;
                  local_5e0.ray = (RTCRayN *)local_678;
                  local_4f0 = uVar79;
                  if ((local_550->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*local_550->occlusionFilterN)(&local_5e0), *local_5e0.valid != 0)) {
                    auVar93 = auVar196._0_16_;
                    p_Var13 = local_670->args->filter;
                    if (p_Var13 != (RTCFilterFunctionN)0x0) {
                      if (((local_670->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((local_550->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var13)(&local_5e0);
                      }
                      auVar93 = auVar196._0_16_;
                      if (*local_5e0.valid == 0) goto LAB_01d1a990;
                    }
                    uVar86 = local_640._0_4_;
                    break;
                  }
LAB_01d1a990:
                  auVar93 = auVar196._0_16_;
                  local_678->tfar = local_500;
                  uVar79 = 0;
                  uVar81 = local_680 ^ 1L << (local_4f0 & 0x3f);
                  for (uVar83 = uVar81; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000
                      ) {
                    uVar79 = uVar79 + 1;
                  }
                  uVar80 = CONCAT71((int7)(local_4f0 >> 8),uVar81 != 0);
                  uVar86 = (uint)uVar80;
                } while (uVar81 != 0);
                local_640._0_4_ = uVar86 & 0xffffff01;
                auVar93 = vxorps_avx512vl(auVar93,auVar93);
                auVar196 = ZEXT1664(auVar93);
                auVar176 = ZEXT3264(local_600);
                in_ZMM20 = ZEXT3264(local_480);
                auVar153 = ZEXT3264(local_620);
                in_ZMM21 = ZEXT3264(local_4a0);
                auVar194 = ZEXT3264(local_440);
                auVar189 = ZEXT3264(local_460);
                auVar192 = ZEXT3264(local_540);
                pre = local_648;
              }
              pRVar82 = (RTCIntersectArguments *)
                        (ulong)CONCAT31(local_580._1_3_,local_580[0] | local_640[0]);
            }
          }
          lVar88 = lVar88 + 8;
          pRVar84 = pRVar82;
          auVar193 = auVar189;
        } while ((int)lVar88 < iVar11);
      }
      if (((ulong)pRVar82 & 1) != 0) {
        return bVar89;
      }
      fVar155 = local_678->tfar;
      auVar28._4_4_ = fVar155;
      auVar28._0_4_ = fVar155;
      auVar28._8_4_ = fVar155;
      auVar28._12_4_ = fVar155;
      auVar28._16_4_ = fVar155;
      auVar28._20_4_ = fVar155;
      auVar28._24_4_ = fVar155;
      auVar28._28_4_ = fVar155;
      uVar80 = vcmpps_avx512vl(local_80,auVar28,2);
      uVar86 = (uint)uVar87 & (uint)uVar80;
      uVar87 = (ulong)uVar86;
      bVar89 = uVar86 != 0;
      context = local_670;
      ray = local_678;
      pPVar85 = local_650;
    } while (bVar89);
  }
  return bVar89;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }